

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersector1<4>::
     occluded_h<embree::avx::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  undefined1 auVar6 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  ulong uVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  uint uVar68;
  uint uVar69;
  undefined1 (*pauVar70) [32];
  ulong uVar71;
  uint uVar72;
  uint uVar73;
  bool bVar74;
  int iVar75;
  ulong uVar76;
  bool bVar77;
  float fVar78;
  float fVar107;
  float fVar110;
  vint4 bi_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar79;
  float fVar80;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar117;
  float fVar120;
  float fVar123;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar108;
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar126;
  undefined1 auVar98 [32];
  float fVar109;
  float fVar112;
  float fVar115;
  float fVar118;
  float fVar121;
  float fVar124;
  undefined1 auVar99 [32];
  float fVar116;
  float fVar119;
  float fVar122;
  float fVar125;
  undefined1 auVar100 [32];
  undefined1 auVar86 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar127;
  float fVar146;
  float fVar148;
  vint4 bi_1;
  undefined1 auVar129 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar150;
  undefined1 auVar130 [16];
  float fVar128;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar138 [32];
  float fVar147;
  float fVar149;
  float fVar152;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vint4 ai;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar161 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar196;
  float fVar197;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar191 [32];
  float fVar202;
  float fVar203;
  undefined1 auVar192 [32];
  float fVar204;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar205;
  float fVar223;
  float fVar224;
  vint4 bi;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar249;
  float fVar252;
  vint4 ai_2;
  undefined1 auVar232 [16];
  float fVar255;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar250;
  float fVar253;
  float fVar256;
  float fVar258;
  float fVar260;
  float fVar262;
  undefined1 auVar238 [32];
  float fVar264;
  undefined1 auVar239 [32];
  float fVar251;
  float fVar254;
  float fVar257;
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar265;
  float fVar266;
  float fVar275;
  float fVar277;
  undefined1 auVar267 [16];
  float fVar280;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar276;
  float fVar278;
  float fVar281;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar279;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar288;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar274 [64];
  float fVar289;
  float fVar303;
  float fVar304;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar292 [16];
  undefined1 auVar295 [32];
  float fVar305;
  float fVar309;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar302 [64];
  vint4 ai_1;
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar315;
  float fVar323;
  float fVar324;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  float fVar325;
  float fVar327;
  float fVar329;
  float fVar331;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar326;
  float fVar328;
  float fVar330;
  undefined1 auVar322 [64];
  undefined1 auVar332 [28];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  float fVar337;
  float fVar347;
  undefined1 auVar338 [32];
  float fVar348;
  undefined1 auVar339 [32];
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  undefined1 auVar340 [64];
  float fVar349;
  float fVar354;
  float fVar355;
  undefined1 auVar350 [16];
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar351 [32];
  float fVar356;
  float fVar360;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  float fVar361;
  float fVar367;
  float fVar369;
  undefined1 auVar363 [16];
  float fVar362;
  float fVar368;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar374;
  float fVar377;
  float fVar380;
  float fVar382;
  undefined1 auVar364 [32];
  float fVar375;
  float fVar378;
  float fVar381;
  undefined1 auVar365 [32];
  float fVar373;
  float fVar376;
  float fVar379;
  undefined1 auVar366 [64];
  undefined1 auVar383 [28];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  int local_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8c0;
  undefined4 local_8b8;
  float local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  uint local_8a8;
  uint local_8a4;
  uint local_8a0;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar8 = prim[1];
  uVar71 = (ulong)(byte)PVar8;
  fVar229 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar188 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  auVar290._0_4_ = fVar229 * (ray->dir).field_0.m128[0];
  auVar290._4_4_ = fVar229 * (ray->dir).field_0.m128[1];
  auVar290._8_4_ = fVar229 * (ray->dir).field_0.m128[2];
  auVar290._12_4_ = fVar229 * (ray->dir).field_0.m128[3];
  auVar156._0_4_ = fVar229 * auVar188._0_4_;
  auVar156._4_4_ = fVar229 * auVar188._4_4_;
  auVar156._8_4_ = fVar229 * auVar188._8_4_;
  auVar156._12_4_ = fVar229 * auVar188._12_4_;
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar162 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar162 = vcvtdq2ps_avx(auVar162);
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar71 + 6)));
  auVar185 = vcvtdq2ps_avx(auVar185);
  uVar76 = (ulong)(uint)((int)(uVar71 * 9) * 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + uVar71 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar76 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar81 = vshufps_avx(auVar290,auVar290,0);
  auVar129 = vshufps_avx(auVar290,auVar290,0x55);
  auVar157 = vshufps_avx(auVar290,auVar290,0xaa);
  fVar229 = auVar157._0_4_;
  fVar174 = auVar157._4_4_;
  fVar249 = auVar157._8_4_;
  fVar196 = auVar157._12_4_;
  fVar265 = auVar129._0_4_;
  fVar275 = auVar129._4_4_;
  fVar277 = auVar129._8_4_;
  fVar280 = auVar129._12_4_;
  fVar252 = auVar81._0_4_;
  fVar197 = auVar81._4_4_;
  fVar255 = auVar81._8_4_;
  fVar198 = auVar81._12_4_;
  auVar350._0_4_ = fVar252 * auVar188._0_4_ + fVar265 * auVar13._0_4_ + fVar229 * auVar14._0_4_;
  auVar350._4_4_ = fVar197 * auVar188._4_4_ + fVar275 * auVar13._4_4_ + fVar174 * auVar14._4_4_;
  auVar350._8_4_ = fVar255 * auVar188._8_4_ + fVar277 * auVar13._8_4_ + fVar249 * auVar14._8_4_;
  auVar350._12_4_ = fVar198 * auVar188._12_4_ + fVar280 * auVar13._12_4_ + fVar196 * auVar14._12_4_;
  auVar363._0_4_ = fVar252 * auVar92._0_4_ + fVar265 * auVar162._0_4_ + auVar185._0_4_ * fVar229;
  auVar363._4_4_ = fVar197 * auVar92._4_4_ + fVar275 * auVar162._4_4_ + auVar185._4_4_ * fVar174;
  auVar363._8_4_ = fVar255 * auVar92._8_4_ + fVar277 * auVar162._8_4_ + auVar185._8_4_ * fVar249;
  auVar363._12_4_ = fVar198 * auVar92._12_4_ + fVar280 * auVar162._12_4_ + auVar185._12_4_ * fVar196
  ;
  auVar291._0_4_ = fVar252 * auVar82._0_4_ + fVar265 * auVar83._0_4_ + auVar137._0_4_ * fVar229;
  auVar291._4_4_ = fVar197 * auVar82._4_4_ + fVar275 * auVar83._4_4_ + auVar137._4_4_ * fVar174;
  auVar291._8_4_ = fVar255 * auVar82._8_4_ + fVar277 * auVar83._8_4_ + auVar137._8_4_ * fVar249;
  auVar291._12_4_ = fVar198 * auVar82._12_4_ + fVar280 * auVar83._12_4_ + auVar137._12_4_ * fVar196;
  auVar81 = vshufps_avx(auVar156,auVar156,0);
  auVar129 = vshufps_avx(auVar156,auVar156,0x55);
  auVar157 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar229 = auVar157._0_4_;
  fVar174 = auVar157._4_4_;
  fVar249 = auVar157._8_4_;
  fVar196 = auVar157._12_4_;
  fVar265 = auVar129._0_4_;
  fVar275 = auVar129._4_4_;
  fVar277 = auVar129._8_4_;
  fVar280 = auVar129._12_4_;
  fVar252 = auVar81._0_4_;
  fVar197 = auVar81._4_4_;
  fVar255 = auVar81._8_4_;
  fVar198 = auVar81._12_4_;
  auVar206._0_4_ = fVar252 * auVar188._0_4_ + fVar265 * auVar13._0_4_ + fVar229 * auVar14._0_4_;
  auVar206._4_4_ = fVar197 * auVar188._4_4_ + fVar275 * auVar13._4_4_ + fVar174 * auVar14._4_4_;
  auVar206._8_4_ = fVar255 * auVar188._8_4_ + fVar277 * auVar13._8_4_ + fVar249 * auVar14._8_4_;
  auVar206._12_4_ = fVar198 * auVar188._12_4_ + fVar280 * auVar13._12_4_ + fVar196 * auVar14._12_4_;
  auVar129._0_4_ = fVar252 * auVar92._0_4_ + auVar185._0_4_ * fVar229 + fVar265 * auVar162._0_4_;
  auVar129._4_4_ = fVar197 * auVar92._4_4_ + auVar185._4_4_ * fVar174 + fVar275 * auVar162._4_4_;
  auVar129._8_4_ = fVar255 * auVar92._8_4_ + auVar185._8_4_ * fVar249 + fVar277 * auVar162._8_4_;
  auVar129._12_4_ = fVar198 * auVar92._12_4_ + auVar185._12_4_ * fVar196 + fVar280 * auVar162._12_4_
  ;
  auVar81._0_4_ = fVar252 * auVar82._0_4_ + fVar265 * auVar83._0_4_ + auVar137._0_4_ * fVar229;
  auVar81._4_4_ = fVar197 * auVar82._4_4_ + fVar275 * auVar83._4_4_ + auVar137._4_4_ * fVar174;
  auVar81._8_4_ = fVar255 * auVar82._8_4_ + fVar277 * auVar83._8_4_ + auVar137._8_4_ * fVar249;
  auVar81._12_4_ = fVar198 * auVar82._12_4_ + fVar280 * auVar83._12_4_ + auVar137._12_4_ * fVar196;
  auVar267._8_4_ = 0x7fffffff;
  auVar267._0_8_ = 0x7fffffff7fffffff;
  auVar267._12_4_ = 0x7fffffff;
  auVar188 = vandps_avx(auVar350,auVar267);
  auVar175._8_4_ = 0x219392ef;
  auVar175._0_8_ = 0x219392ef219392ef;
  auVar175._12_4_ = 0x219392ef;
  auVar188 = vcmpps_avx(auVar188,auVar175,1);
  auVar13 = vblendvps_avx(auVar350,auVar175,auVar188);
  auVar188 = vandps_avx(auVar363,auVar267);
  auVar188 = vcmpps_avx(auVar188,auVar175,1);
  auVar14 = vblendvps_avx(auVar363,auVar175,auVar188);
  auVar188 = vandps_avx(auVar291,auVar267);
  auVar188 = vcmpps_avx(auVar188,auVar175,1);
  auVar188 = vblendvps_avx(auVar291,auVar175,auVar188);
  auVar92 = vrcpps_avx(auVar13);
  fVar265 = auVar92._0_4_;
  auVar157._0_4_ = fVar265 * auVar13._0_4_;
  fVar275 = auVar92._4_4_;
  auVar157._4_4_ = fVar275 * auVar13._4_4_;
  fVar277 = auVar92._8_4_;
  auVar157._8_4_ = fVar277 * auVar13._8_4_;
  fVar280 = auVar92._12_4_;
  auVar157._12_4_ = fVar280 * auVar13._12_4_;
  auVar292._8_4_ = 0x3f800000;
  auVar292._0_8_ = 0x3f8000003f800000;
  auVar292._12_4_ = 0x3f800000;
  auVar13 = vsubps_avx(auVar292,auVar157);
  fVar265 = fVar265 + fVar265 * auVar13._0_4_;
  fVar275 = fVar275 + fVar275 * auVar13._4_4_;
  fVar277 = fVar277 + fVar277 * auVar13._8_4_;
  fVar280 = fVar280 + fVar280 * auVar13._12_4_;
  auVar13 = vrcpps_avx(auVar14);
  fVar229 = auVar13._0_4_;
  auVar232._0_4_ = fVar229 * auVar14._0_4_;
  fVar249 = auVar13._4_4_;
  auVar232._4_4_ = fVar249 * auVar14._4_4_;
  fVar252 = auVar13._8_4_;
  auVar232._8_4_ = fVar252 * auVar14._8_4_;
  fVar255 = auVar13._12_4_;
  auVar232._12_4_ = fVar255 * auVar14._12_4_;
  auVar13 = vsubps_avx(auVar292,auVar232);
  fVar229 = fVar229 + fVar229 * auVar13._0_4_;
  fVar249 = fVar249 + fVar249 * auVar13._4_4_;
  fVar252 = fVar252 + fVar252 * auVar13._8_4_;
  fVar255 = fVar255 + fVar255 * auVar13._12_4_;
  auVar13 = vrcpps_avx(auVar188);
  fVar174 = auVar13._0_4_;
  auVar176._0_4_ = fVar174 * auVar188._0_4_;
  fVar196 = auVar13._4_4_;
  auVar176._4_4_ = fVar196 * auVar188._4_4_;
  fVar197 = auVar13._8_4_;
  auVar176._8_4_ = fVar197 * auVar188._8_4_;
  fVar198 = auVar13._12_4_;
  auVar176._12_4_ = fVar198 * auVar188._12_4_;
  auVar188 = vsubps_avx(auVar292,auVar176);
  fVar174 = fVar174 + fVar174 * auVar188._0_4_;
  fVar196 = fVar196 + fVar196 * auVar188._4_4_;
  fVar197 = fVar197 + fVar197 * auVar188._8_4_;
  fVar198 = fVar198 + fVar198 * auVar188._12_4_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar188 = vpmovsxwd_avx(auVar188);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar206);
  auVar158._0_4_ = fVar265 * auVar188._0_4_;
  auVar158._4_4_ = fVar275 * auVar188._4_4_;
  auVar158._8_4_ = fVar277 * auVar188._8_4_;
  auVar158._12_4_ = fVar280 * auVar188._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar188 = vpmovsxwd_avx(auVar13);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar206);
  auVar207._0_4_ = fVar265 * auVar188._0_4_;
  auVar207._4_4_ = fVar275 * auVar188._4_4_;
  auVar207._8_4_ = fVar277 * auVar188._8_4_;
  auVar207._12_4_ = fVar280 * auVar188._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar14);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar71 * -2 + 6);
  auVar188 = vpmovsxwd_avx(auVar92);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar129);
  auVar310._0_4_ = auVar188._0_4_ * fVar229;
  auVar310._4_4_ = auVar188._4_4_ * fVar249;
  auVar310._8_4_ = auVar188._8_4_ * fVar252;
  auVar310._12_4_ = auVar188._12_4_ * fVar255;
  auVar188 = vcvtdq2ps_avx(auVar13);
  auVar188 = vsubps_avx(auVar188,auVar129);
  auVar137._0_4_ = fVar229 * auVar188._0_4_;
  auVar137._4_4_ = fVar249 * auVar188._4_4_;
  auVar137._8_4_ = fVar252 * auVar188._8_4_;
  auVar137._12_4_ = fVar255 * auVar188._12_4_;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar76 + uVar71 + 6);
  auVar188 = vpmovsxwd_avx(auVar162);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar81);
  auVar233._0_4_ = auVar188._0_4_ * fVar174;
  auVar233._4_4_ = auVar188._4_4_ * fVar196;
  auVar233._8_4_ = auVar188._8_4_ * fVar197;
  auVar233._12_4_ = auVar188._12_4_ * fVar198;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar188 = vpmovsxwd_avx(auVar185);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar81);
  auVar82._0_4_ = auVar188._0_4_ * fVar174;
  auVar82._4_4_ = auVar188._4_4_ * fVar196;
  auVar82._8_4_ = auVar188._8_4_ * fVar197;
  auVar82._12_4_ = auVar188._12_4_ * fVar198;
  auVar188 = vpminsd_avx(auVar158,auVar207);
  auVar13 = vpminsd_avx(auVar310,auVar137);
  auVar188 = vmaxps_avx(auVar188,auVar13);
  auVar13 = vpminsd_avx(auVar233,auVar82);
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar316._4_4_ = uVar2;
  auVar316._0_4_ = uVar2;
  auVar316._8_4_ = uVar2;
  auVar316._12_4_ = uVar2;
  auVar13 = vmaxps_avx(auVar13,auVar316);
  auVar188 = vmaxps_avx(auVar188,auVar13);
  local_4a0._0_4_ = auVar188._0_4_ * 0.99999964;
  local_4a0._4_4_ = auVar188._4_4_ * 0.99999964;
  local_4a0._8_4_ = auVar188._8_4_ * 0.99999964;
  local_4a0._12_4_ = auVar188._12_4_ * 0.99999964;
  auVar188 = vpmaxsd_avx(auVar158,auVar207);
  auVar13 = vpmaxsd_avx(auVar310,auVar137);
  auVar188 = vminps_avx(auVar188,auVar13);
  auVar13 = vpmaxsd_avx(auVar233,auVar82);
  fVar229 = ray->tfar;
  auVar159._4_4_ = fVar229;
  auVar159._0_4_ = fVar229;
  auVar159._8_4_ = fVar229;
  auVar159._12_4_ = fVar229;
  auVar13 = vminps_avx(auVar13,auVar159);
  auVar188 = vminps_avx(auVar188,auVar13);
  auVar83._0_4_ = auVar188._0_4_ * 1.0000004;
  auVar83._4_4_ = auVar188._4_4_ * 1.0000004;
  auVar83._8_4_ = auVar188._8_4_ * 1.0000004;
  auVar83._12_4_ = auVar188._12_4_ * 1.0000004;
  auVar188 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar13 = vpcmpgtd_avx(auVar188,_DAT_01f7fcf0);
  auVar188 = vcmpps_avx(local_4a0,auVar83,2);
  auVar188 = vandps_avx(auVar188,auVar13);
  uVar68 = vmovmskps_avx(auVar188);
  if (uVar68 == 0) {
    return false;
  }
  uVar68 = uVar68 & 0xff;
  auVar96._16_16_ = mm_lookupmask_ps._240_16_;
  auVar96._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar96,ZEXT832(0) << 0x20,0x80);
  local_7b0 = prim;
LAB_00e4431e:
  local_7a8 = (ulong)uVar68;
  lVar11 = 0;
  if (local_7a8 != 0) {
    for (; (uVar68 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  uVar68 = *(uint *)(local_7b0 + 2);
  local_888 = (ulong)*(uint *)(local_7b0 + lVar11 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar68].ptr;
  lVar11 = *(long *)&pGVar9[1].time_range.upper;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           local_888 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar188 = *(undefined1 (*) [16])(lVar11 + (long)pGVar9[1].intersectionFilterN * uVar76);
  auVar13 = *(undefined1 (*) [16])(lVar11 + (long)pGVar9[1].intersectionFilterN * (uVar76 + 1));
  pfVar1 = (float *)(pGVar9[2].intersectionFilterN + uVar76 * (long)pGVar9[2].pointQueryFunc);
  auVar208._0_4_ = auVar188._0_4_ + *pfVar1 * 0.33333334;
  auVar208._4_4_ = auVar188._4_4_ + pfVar1[1] * 0.33333334;
  auVar208._8_4_ = auVar188._8_4_ + pfVar1[2] * 0.33333334;
  auVar208._12_4_ = auVar188._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar9[2].intersectionFilterN + (long)pGVar9[2].pointQueryFunc * (uVar76 + 1));
  auVar84._0_4_ = *pfVar1 * 0.33333334;
  auVar84._4_4_ = pfVar1[1] * 0.33333334;
  auVar84._8_4_ = pfVar1[2] * 0.33333334;
  auVar84._12_4_ = pfVar1[3] * 0.33333334;
  auVar185 = vsubps_avx(auVar13,auVar84);
  auVar85._0_4_ = (auVar13._0_4_ + auVar188._0_4_ + auVar208._0_4_ + auVar185._0_4_) * 0.25;
  auVar85._4_4_ = (auVar13._4_4_ + auVar188._4_4_ + auVar208._4_4_ + auVar185._4_4_) * 0.25;
  auVar85._8_4_ = (auVar13._8_4_ + auVar188._8_4_ + auVar208._8_4_ + auVar185._8_4_) * 0.25;
  auVar85._12_4_ = (auVar13._12_4_ + auVar188._12_4_ + auVar208._12_4_ + auVar185._12_4_) * 0.25;
  aVar4 = (ray->org).field_0.field_1;
  aVar5 = (ray->dir).field_0.field_1;
  auVar14 = vsubps_avx(auVar85,(undefined1  [16])aVar4);
  auVar14 = vdpps_avx(auVar14,(undefined1  [16])aVar5,0x7f);
  auVar92 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  auVar162 = vrcpss_avx(auVar92,auVar92);
  fVar229 = auVar14._0_4_ * auVar162._0_4_ * (2.0 - auVar162._0_4_ * auVar92._0_4_);
  local_7c0 = ZEXT416((uint)fVar229);
  auVar92 = vshufps_avx(local_7c0,ZEXT416((uint)fVar229),0);
  fVar229 = aVar5.x;
  fVar174 = aVar5.y;
  fVar249 = aVar5.z;
  aVar150 = aVar5.field_3;
  auVar268._0_4_ = aVar4.x + fVar229 * auVar92._0_4_;
  auVar268._4_4_ = aVar4.y + fVar174 * auVar92._4_4_;
  auVar268._8_4_ = aVar4.z + fVar249 * auVar92._8_4_;
  auVar268._12_4_ = aVar4.field_3.w + aVar150.w * auVar92._12_4_;
  auVar14 = vblendps_avx(auVar268,_DAT_01f7aa10,8);
  _local_960 = vsubps_avx(auVar188,auVar14);
  _local_970 = vsubps_avx(auVar185,auVar14);
  _local_980 = vsubps_avx(auVar208,auVar14);
  _local_990 = vsubps_avx(auVar13,auVar14);
  auVar274 = ZEXT1664(_local_990);
  auVar188 = vshufps_avx(_local_960,_local_960,0);
  local_9e0._16_16_ = auVar188;
  local_9e0._0_16_ = auVar188;
  auVar302 = ZEXT3264(local_9e0);
  auVar188 = vshufps_avx(_local_960,_local_960,0x55);
  local_a00._16_16_ = auVar188;
  local_a00._0_16_ = auVar188;
  auVar336 = ZEXT3264(local_a00);
  auVar188 = vshufps_avx(_local_960,_local_960,0xaa);
  local_a20._16_16_ = auVar188;
  local_a20._0_16_ = auVar188;
  auVar340 = ZEXT3264(local_a20);
  auVar188 = vshufps_avx(_local_960,_local_960,0xff);
  local_8e0._16_16_ = auVar188;
  local_8e0._0_16_ = auVar188;
  auVar389 = ZEXT3264(local_8e0);
  auVar188 = vshufps_avx(_local_980,_local_980,0);
  auVar351._16_16_ = auVar188;
  auVar351._0_16_ = auVar188;
  auVar188 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001290 = auVar188;
  _local_1e0 = auVar188;
  auVar188 = vshufps_avx(_local_980,_local_980,0xaa);
  local_9c0._16_16_ = auVar188;
  local_9c0._0_16_ = auVar188;
  auVar366 = ZEXT3264(local_9c0);
  auVar130._0_4_ = fVar229 * fVar229;
  auVar130._4_4_ = fVar174 * fVar174;
  auVar130._8_4_ = fVar249 * fVar249;
  auVar130._12_4_ = aVar150.w * aVar150.w;
  auVar188 = vshufps_avx(auVar130,auVar130,0xaa);
  auVar13 = vshufps_avx(auVar130,auVar130,0x55);
  auVar14 = vshufps_avx(_local_980,_local_980,0xff);
  local_900._16_16_ = auVar14;
  local_900._0_16_ = auVar14;
  auVar322 = ZEXT3264(local_900);
  auVar14 = vshufps_avx(auVar130,auVar130,0);
  local_200._0_4_ = auVar14._0_4_ + auVar13._0_4_ + auVar188._0_4_;
  local_200._4_4_ = auVar14._4_4_ + auVar13._4_4_ + auVar188._4_4_;
  local_200._8_4_ = auVar14._8_4_ + auVar13._8_4_ + auVar188._8_4_;
  local_200._12_4_ = auVar14._12_4_ + auVar13._12_4_ + auVar188._12_4_;
  local_200._16_4_ = auVar14._0_4_ + auVar13._0_4_ + auVar188._0_4_;
  local_200._20_4_ = auVar14._4_4_ + auVar13._4_4_ + auVar188._4_4_;
  local_200._24_4_ = auVar14._8_4_ + auVar13._8_4_ + auVar188._8_4_;
  local_200._28_4_ = auVar14._12_4_ + auVar13._12_4_ + auVar188._12_4_;
  auVar188 = vshufps_avx(_local_970,_local_970,0);
  register0x00001250 = auVar188;
  _local_220 = auVar188;
  auVar188 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001250 = auVar188;
  _local_240 = auVar188;
  auVar188 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001250 = auVar188;
  _local_260 = auVar188;
  auVar188 = vshufps_avx(_local_970,_local_970,0xff);
  register0x00001250 = auVar188;
  _local_280 = auVar188;
  auVar188 = vshufps_avx(_local_990,_local_990,0);
  register0x00001250 = auVar188;
  _local_2a0 = auVar188;
  auVar188 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001250 = auVar188;
  _local_2c0 = auVar188;
  auVar188 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001250 = auVar188;
  _local_2e0 = auVar188;
  auVar188 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001250 = auVar188;
  _local_300 = auVar188;
  register0x00001210 = auVar92;
  _local_640 = auVar92;
  local_b44 = 1;
  uVar76 = 0;
  bVar74 = false;
  local_6e0 = (ray->dir).field_0.m128[0];
  local_700 = (ray->dir).field_0.m128[1];
  local_720 = (ray->dir).field_0.m128[2];
  auVar97._8_4_ = 0x7fffffff;
  auVar97._0_8_ = 0x7fffffff7fffffff;
  auVar97._12_4_ = 0x7fffffff;
  auVar97._16_4_ = 0x7fffffff;
  auVar97._20_4_ = 0x7fffffff;
  auVar97._24_4_ = 0x7fffffff;
  auVar97._28_4_ = 0x7fffffff;
  local_3c0 = vandps_avx(local_200,auVar97);
  local_490 = ZEXT816(0x3f80000000000000);
  local_3a0 = auVar351;
  fStack_71c = local_720;
  fStack_718 = local_720;
  fStack_714 = local_720;
  fStack_710 = local_720;
  fStack_70c = local_720;
  fStack_708 = local_720;
  fStack_704 = local_720;
  fStack_6fc = local_700;
  fStack_6f8 = local_700;
  fStack_6f4 = local_700;
  fStack_6f0 = local_700;
  fStack_6ec = local_700;
  fStack_6e8 = local_700;
  fStack_6e4 = local_700;
  fStack_6dc = local_6e0;
  fStack_6d8 = local_6e0;
  fStack_6d4 = local_6e0;
  fStack_6d0 = local_6e0;
  fStack_6cc = local_6e0;
  fStack_6c8 = local_6e0;
  fStack_6c4 = local_6e0;
  do {
    auVar191._8_4_ = 0x3f800000;
    auVar191._0_8_ = 0x3f8000003f800000;
    auVar191._12_4_ = 0x3f800000;
    auVar191._16_4_ = 0x3f800000;
    auVar191._20_4_ = 0x3f800000;
    iVar75 = (int)uVar76;
    auVar191._24_4_ = 0x3f800000;
    auVar191._28_4_ = 0x3f800000;
    auVar188 = vmovshdup_avx(local_490);
    auVar14 = vsubps_avx(auVar188,local_490);
    auVar188 = vshufps_avx(local_490,local_490,0);
    local_680._16_16_ = auVar188;
    local_680._0_16_ = auVar188;
    auVar13 = vshufps_avx(auVar14,auVar14,0);
    local_6a0._16_16_ = auVar13;
    local_6a0._0_16_ = auVar13;
    fVar127 = auVar13._0_4_;
    fVar146 = auVar13._4_4_;
    fVar148 = auVar13._8_4_;
    fVar151 = auVar13._12_4_;
    fVar78 = auVar188._0_4_;
    auVar138._0_4_ = fVar78 + fVar127 * 0.0;
    fVar107 = auVar188._4_4_;
    auVar138._4_4_ = fVar107 + fVar146 * 0.14285715;
    fVar110 = auVar188._8_4_;
    auVar138._8_4_ = fVar110 + fVar148 * 0.2857143;
    fVar113 = auVar188._12_4_;
    auVar138._12_4_ = fVar113 + fVar151 * 0.42857146;
    auVar138._16_4_ = fVar78 + fVar127 * 0.5714286;
    auVar138._20_4_ = fVar107 + fVar146 * 0.71428573;
    auVar138._24_4_ = fVar110 + fVar148 * 0.8571429;
    auVar138._28_4_ = fVar113 + fVar151;
    auVar96 = vsubps_avx(auVar191,auVar138);
    fVar198 = auVar351._28_4_;
    fVar229 = auVar96._0_4_;
    fVar174 = auVar96._4_4_;
    fVar249 = auVar96._8_4_;
    fVar196 = auVar96._12_4_;
    fVar252 = auVar96._16_4_;
    fVar197 = auVar96._20_4_;
    fVar255 = auVar96._24_4_;
    fVar202 = auVar302._28_4_ + 1.0;
    fVar203 = auVar274._28_4_ + fVar198 + fVar202;
    fVar266 = (float)local_220._0_4_ * auVar138._0_4_ + auVar351._0_4_ * fVar229;
    fVar276 = (float)local_220._4_4_ * auVar138._4_4_ + auVar351._4_4_ * fVar174;
    fVar278 = fStack_218 * auVar138._8_4_ + auVar351._8_4_ * fVar249;
    fVar281 = fStack_214 * auVar138._12_4_ + auVar351._12_4_ * fVar196;
    fVar283 = fStack_210 * auVar138._16_4_ + auVar351._16_4_ * fVar252;
    fVar285 = fStack_20c * auVar138._20_4_ + auVar351._20_4_ * fVar197;
    fVar287 = fStack_208 * auVar138._24_4_ + auVar351._24_4_ * fVar255;
    fVar265 = (float)local_240._0_4_ * auVar138._0_4_ + (float)local_1e0._0_4_ * fVar229;
    fVar275 = (float)local_240._4_4_ * auVar138._4_4_ + (float)local_1e0._4_4_ * fVar174;
    fVar277 = fStack_238 * auVar138._8_4_ + fStack_1d8 * fVar249;
    fVar280 = fStack_234 * auVar138._12_4_ + fStack_1d4 * fVar196;
    fVar199 = fStack_230 * auVar138._16_4_ + fStack_1d0 * fVar252;
    fVar200 = fStack_22c * auVar138._20_4_ + fStack_1cc * fVar197;
    fVar201 = fStack_228 * auVar138._24_4_ + fStack_1c8 * fVar255;
    fVar205 = (float)local_260._0_4_ * auVar138._0_4_ + auVar366._0_4_ * fVar229;
    fVar223 = (float)local_260._4_4_ * auVar138._4_4_ + auVar366._4_4_ * fVar174;
    fVar224 = fStack_258 * auVar138._8_4_ + auVar366._8_4_ * fVar249;
    fVar225 = fStack_254 * auVar138._12_4_ + auVar366._12_4_ * fVar196;
    fVar226 = fStack_250 * auVar138._16_4_ + auVar366._16_4_ * fVar252;
    fVar227 = fStack_24c * auVar138._20_4_ + auVar366._20_4_ * fVar197;
    fVar228 = fStack_248 * auVar138._24_4_ + auVar366._24_4_ * fVar255;
    fVar230 = (float)local_280._0_4_ * auVar138._0_4_ + auVar322._0_4_ * fVar229;
    fVar250 = (float)local_280._4_4_ * auVar138._4_4_ + auVar322._4_4_ * fVar174;
    fVar253 = fStack_278 * auVar138._8_4_ + auVar322._8_4_ * fVar249;
    fVar256 = fStack_274 * auVar138._12_4_ + auVar322._12_4_ * fVar196;
    fVar258 = fStack_270 * auVar138._16_4_ + auVar322._16_4_ * fVar252;
    fVar260 = fStack_26c * auVar138._20_4_ + auVar322._20_4_ * fVar197;
    fVar262 = fStack_268 * auVar138._24_4_ + auVar322._24_4_ * fVar255;
    fVar347 = auVar340._28_4_;
    fVar382 = fVar347 + auVar366._28_4_;
    fVar360 = fVar198 + fVar347;
    auVar319._0_4_ =
         fVar229 * (auVar351._0_4_ * auVar138._0_4_ + auVar302._0_4_ * fVar229) +
         auVar138._0_4_ * fVar266;
    auVar319._4_4_ =
         fVar174 * (auVar351._4_4_ * auVar138._4_4_ + auVar302._4_4_ * fVar174) +
         auVar138._4_4_ * fVar276;
    auVar319._8_4_ =
         fVar249 * (auVar351._8_4_ * auVar138._8_4_ + auVar302._8_4_ * fVar249) +
         auVar138._8_4_ * fVar278;
    auVar319._12_4_ =
         fVar196 * (auVar351._12_4_ * auVar138._12_4_ + auVar302._12_4_ * fVar196) +
         auVar138._12_4_ * fVar281;
    auVar319._16_4_ =
         fVar252 * (auVar351._16_4_ * auVar138._16_4_ + auVar302._16_4_ * fVar252) +
         auVar138._16_4_ * fVar283;
    auVar319._20_4_ =
         fVar197 * (auVar351._20_4_ * auVar138._20_4_ + auVar302._20_4_ * fVar197) +
         auVar138._20_4_ * fVar285;
    auVar319._24_4_ =
         fVar255 * (auVar351._24_4_ * auVar138._24_4_ + auVar302._24_4_ * fVar255) +
         auVar138._24_4_ * fVar287;
    auVar319._28_4_ = auVar322._28_4_ + fVar347;
    auVar333._0_4_ =
         ((float)local_1e0._0_4_ * auVar138._0_4_ + auVar336._0_4_ * fVar229) * fVar229 +
         auVar138._0_4_ * fVar265;
    auVar333._4_4_ =
         ((float)local_1e0._4_4_ * auVar138._4_4_ + auVar336._4_4_ * fVar174) * fVar174 +
         auVar138._4_4_ * fVar275;
    auVar333._8_4_ =
         (fStack_1d8 * auVar138._8_4_ + auVar336._8_4_ * fVar249) * fVar249 +
         auVar138._8_4_ * fVar277;
    auVar333._12_4_ =
         (fStack_1d4 * auVar138._12_4_ + auVar336._12_4_ * fVar196) * fVar196 +
         auVar138._12_4_ * fVar280;
    auVar333._16_4_ =
         (fStack_1d0 * auVar138._16_4_ + auVar336._16_4_ * fVar252) * fVar252 +
         auVar138._16_4_ * fVar199;
    auVar333._20_4_ =
         (fStack_1cc * auVar138._20_4_ + auVar336._20_4_ * fVar197) * fVar197 +
         auVar138._20_4_ * fVar200;
    auVar333._24_4_ =
         (fStack_1c8 * auVar138._24_4_ + auVar336._24_4_ * fVar255) * fVar255 +
         auVar138._24_4_ * fVar201;
    auVar333._28_4_ = fVar202 + 1.0 + fVar347;
    auVar338._0_4_ =
         fVar229 * (auVar366._0_4_ * auVar138._0_4_ + auVar340._0_4_ * fVar229) +
         auVar138._0_4_ * fVar205;
    auVar338._4_4_ =
         fVar174 * (auVar366._4_4_ * auVar138._4_4_ + auVar340._4_4_ * fVar174) +
         auVar138._4_4_ * fVar223;
    auVar338._8_4_ =
         fVar249 * (auVar366._8_4_ * auVar138._8_4_ + auVar340._8_4_ * fVar249) +
         auVar138._8_4_ * fVar224;
    auVar338._12_4_ =
         fVar196 * (auVar366._12_4_ * auVar138._12_4_ + auVar340._12_4_ * fVar196) +
         auVar138._12_4_ * fVar225;
    auVar338._16_4_ =
         fVar252 * (auVar366._16_4_ * auVar138._16_4_ + auVar340._16_4_ * fVar252) +
         auVar138._16_4_ * fVar226;
    auVar338._20_4_ =
         fVar197 * (auVar366._20_4_ * auVar138._20_4_ + auVar340._20_4_ * fVar197) +
         auVar138._20_4_ * fVar227;
    auVar338._24_4_ =
         fVar255 * (auVar366._24_4_ * auVar138._24_4_ + auVar340._24_4_ * fVar255) +
         auVar138._24_4_ * fVar228;
    auVar338._28_4_ = fStack_204 + fVar347;
    auVar295._0_4_ =
         auVar138._0_4_ * fVar230 +
         fVar229 * (auVar322._0_4_ * auVar138._0_4_ + auVar389._0_4_ * fVar229);
    auVar295._4_4_ =
         auVar138._4_4_ * fVar250 +
         fVar174 * (auVar322._4_4_ * auVar138._4_4_ + auVar389._4_4_ * fVar174);
    auVar295._8_4_ =
         auVar138._8_4_ * fVar253 +
         fVar249 * (auVar322._8_4_ * auVar138._8_4_ + auVar389._8_4_ * fVar249);
    auVar295._12_4_ =
         auVar138._12_4_ * fVar256 +
         fVar196 * (auVar322._12_4_ * auVar138._12_4_ + auVar389._12_4_ * fVar196);
    auVar295._16_4_ =
         auVar138._16_4_ * fVar258 +
         fVar252 * (auVar322._16_4_ * auVar138._16_4_ + auVar389._16_4_ * fVar252);
    auVar295._20_4_ =
         auVar138._20_4_ * fVar260 +
         fVar197 * (auVar322._20_4_ * auVar138._20_4_ + auVar389._20_4_ * fVar197);
    auVar295._24_4_ =
         auVar138._24_4_ * fVar262 +
         fVar255 * (auVar322._24_4_ * auVar138._24_4_ + auVar389._24_4_ * fVar255);
    auVar295._28_4_ = fStack_204 + fStack_264;
    auVar270._0_4_ =
         (auVar138._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar229) *
         auVar138._0_4_ + fVar229 * fVar266;
    auVar270._4_4_ =
         (auVar138._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar174) *
         auVar138._4_4_ + fVar174 * fVar276;
    auVar270._8_4_ =
         (auVar138._8_4_ * fStack_298 + fStack_218 * fVar249) * auVar138._8_4_ + fVar249 * fVar278;
    auVar270._12_4_ =
         (auVar138._12_4_ * fStack_294 + fStack_214 * fVar196) * auVar138._12_4_ + fVar196 * fVar281
    ;
    auVar270._16_4_ =
         (auVar138._16_4_ * fStack_290 + fStack_210 * fVar252) * auVar138._16_4_ + fVar252 * fVar283
    ;
    auVar270._20_4_ =
         (auVar138._20_4_ * fStack_28c + fStack_20c * fVar197) * auVar138._20_4_ + fVar197 * fVar285
    ;
    auVar270._24_4_ =
         (auVar138._24_4_ * fStack_288 + fStack_208 * fVar255) * auVar138._24_4_ + fVar255 * fVar287
    ;
    auVar270._28_4_ = fStack_204 + fVar203 + auVar274._28_4_;
    auVar192._0_4_ =
         (auVar138._0_4_ * (float)local_2c0._0_4_ + (float)local_240._0_4_ * fVar229) *
         auVar138._0_4_ + fVar229 * fVar265;
    auVar192._4_4_ =
         (auVar138._4_4_ * (float)local_2c0._4_4_ + (float)local_240._4_4_ * fVar174) *
         auVar138._4_4_ + fVar174 * fVar275;
    auVar192._8_4_ =
         (auVar138._8_4_ * fStack_2b8 + fStack_238 * fVar249) * auVar138._8_4_ + fVar249 * fVar277;
    auVar192._12_4_ =
         (auVar138._12_4_ * fStack_2b4 + fStack_234 * fVar196) * auVar138._12_4_ + fVar196 * fVar280
    ;
    auVar192._16_4_ =
         (auVar138._16_4_ * fStack_2b0 + fStack_230 * fVar252) * auVar138._16_4_ + fVar252 * fVar199
    ;
    auVar192._20_4_ =
         (auVar138._20_4_ * fStack_2ac + fStack_22c * fVar197) * auVar138._20_4_ + fVar197 * fVar200
    ;
    auVar192._24_4_ =
         (auVar138._24_4_ * fStack_2a8 + fStack_228 * fVar255) * auVar138._24_4_ + fVar255 * fVar201
    ;
    auVar192._28_4_ = fStack_204 + fVar203 + 1.0;
    auVar217._0_4_ =
         (auVar138._0_4_ * (float)local_2e0._0_4_ + (float)local_260._0_4_ * fVar229) *
         auVar138._0_4_ + fVar229 * fVar205;
    auVar217._4_4_ =
         (auVar138._4_4_ * (float)local_2e0._4_4_ + (float)local_260._4_4_ * fVar174) *
         auVar138._4_4_ + fVar174 * fVar223;
    auVar217._8_4_ =
         (auVar138._8_4_ * fStack_2d8 + fStack_258 * fVar249) * auVar138._8_4_ + fVar249 * fVar224;
    auVar217._12_4_ =
         (auVar138._12_4_ * fStack_2d4 + fStack_254 * fVar196) * auVar138._12_4_ + fVar196 * fVar225
    ;
    auVar217._16_4_ =
         (auVar138._16_4_ * fStack_2d0 + fStack_250 * fVar252) * auVar138._16_4_ + fVar252 * fVar226
    ;
    auVar217._20_4_ =
         (auVar138._20_4_ * fStack_2cc + fStack_24c * fVar197) * auVar138._20_4_ + fVar197 * fVar227
    ;
    auVar217._24_4_ =
         (auVar138._24_4_ * fStack_2c8 + fStack_248 * fVar255) * auVar138._24_4_ + fVar255 * fVar228
    ;
    auVar217._28_4_ = fVar360 + fVar198 + 1.0;
    auVar238._0_4_ =
         (auVar138._0_4_ * (float)local_300._0_4_ + (float)local_280._0_4_ * fVar229) *
         auVar138._0_4_ + fVar229 * fVar230;
    auVar238._4_4_ =
         (auVar138._4_4_ * (float)local_300._4_4_ + (float)local_280._4_4_ * fVar174) *
         auVar138._4_4_ + fVar174 * fVar250;
    auVar238._8_4_ =
         (auVar138._8_4_ * fStack_2f8 + fStack_278 * fVar249) * auVar138._8_4_ + fVar249 * fVar253;
    auVar238._12_4_ =
         (auVar138._12_4_ * fStack_2f4 + fStack_274 * fVar196) * auVar138._12_4_ + fVar196 * fVar256
    ;
    auVar238._16_4_ =
         (auVar138._16_4_ * fStack_2f0 + fStack_270 * fVar252) * auVar138._16_4_ + fVar252 * fVar258
    ;
    auVar238._20_4_ =
         (auVar138._20_4_ * fStack_2ec + fStack_26c * fVar197) * auVar138._20_4_ + fVar197 * fVar260
    ;
    auVar238._24_4_ =
         (auVar138._24_4_ * fStack_2e8 + fStack_268 * fVar255) * auVar138._24_4_ + fVar255 * fVar262
    ;
    auVar238._28_4_ = fVar382 + fVar347 + fVar198;
    fVar79 = auVar319._0_4_ * fVar229 + auVar138._0_4_ * auVar270._0_4_;
    fVar108 = auVar319._4_4_ * fVar174 + auVar138._4_4_ * auVar270._4_4_;
    fVar111 = auVar319._8_4_ * fVar249 + auVar138._8_4_ * auVar270._8_4_;
    fVar114 = auVar319._12_4_ * fVar196 + auVar138._12_4_ * auVar270._12_4_;
    fVar117 = auVar319._16_4_ * fVar252 + auVar138._16_4_ * auVar270._16_4_;
    fVar120 = auVar319._20_4_ * fVar197 + auVar138._20_4_ * auVar270._20_4_;
    fVar123 = auVar319._24_4_ * fVar255 + auVar138._24_4_ * auVar270._24_4_;
    fVar126 = fVar382 + fStack_204;
    auVar387._0_4_ = auVar333._0_4_ * fVar229 + auVar138._0_4_ * auVar192._0_4_;
    auVar387._4_4_ = auVar333._4_4_ * fVar174 + auVar138._4_4_ * auVar192._4_4_;
    auVar387._8_4_ = auVar333._8_4_ * fVar249 + auVar138._8_4_ * auVar192._8_4_;
    auVar387._12_4_ = auVar333._12_4_ * fVar196 + auVar138._12_4_ * auVar192._12_4_;
    auVar387._16_4_ = auVar333._16_4_ * fVar252 + auVar138._16_4_ * auVar192._16_4_;
    auVar387._20_4_ = auVar333._20_4_ * fVar197 + auVar138._20_4_ * auVar192._20_4_;
    auVar387._24_4_ = auVar333._24_4_ * fVar255 + auVar138._24_4_ * auVar192._24_4_;
    auVar387._28_4_ = fStack_204 + fVar360;
    auVar384._0_4_ = auVar338._0_4_ * fVar229 + auVar138._0_4_ * auVar217._0_4_;
    auVar384._4_4_ = auVar338._4_4_ * fVar174 + auVar138._4_4_ * auVar217._4_4_;
    auVar384._8_4_ = auVar338._8_4_ * fVar249 + auVar138._8_4_ * auVar217._8_4_;
    auVar384._12_4_ = auVar338._12_4_ * fVar196 + auVar138._12_4_ * auVar217._12_4_;
    auVar384._16_4_ = auVar338._16_4_ * fVar252 + auVar138._16_4_ * auVar217._16_4_;
    auVar384._20_4_ = auVar338._20_4_ * fVar197 + auVar138._20_4_ * auVar217._20_4_;
    auVar384._24_4_ = auVar338._24_4_ * fVar255 + auVar138._24_4_ * auVar217._24_4_;
    auVar384._28_4_ = fVar360 + fStack_204;
    local_b40._0_4_ = auVar14._0_4_;
    local_6c0._0_4_ = fVar229 * auVar295._0_4_ + auVar138._0_4_ * auVar238._0_4_;
    local_6c0._4_4_ = fVar174 * auVar295._4_4_ + auVar138._4_4_ * auVar238._4_4_;
    local_6c0._8_4_ = fVar249 * auVar295._8_4_ + auVar138._8_4_ * auVar238._8_4_;
    local_6c0._12_4_ = fVar196 * auVar295._12_4_ + auVar138._12_4_ * auVar238._12_4_;
    local_6c0._16_4_ = fVar252 * auVar295._16_4_ + auVar138._16_4_ * auVar238._16_4_;
    local_6c0._20_4_ = fVar197 * auVar295._20_4_ + auVar138._20_4_ * auVar238._20_4_;
    local_6c0._24_4_ = fVar255 * auVar295._24_4_ + auVar138._24_4_ * auVar238._24_4_;
    local_6c0._28_4_ = auVar96._28_4_ + auVar138._28_4_;
    auVar96 = vsubps_avx(auVar270,auVar319);
    auVar351 = vsubps_avx(auVar192,auVar333);
    auVar97 = vsubps_avx(auVar217,auVar338);
    auVar138 = vsubps_avx(auVar238,auVar295);
    auVar188 = vshufps_avx(ZEXT416((uint)((float)local_b40._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_b40._0_4_ * 0.04761905)),0);
    fVar252 = auVar188._0_4_;
    fVar349 = fVar252 * auVar96._0_4_ * 3.0;
    fVar255 = auVar188._4_4_;
    fVar354 = fVar255 * auVar96._4_4_ * 3.0;
    local_880._4_4_ = fVar354;
    local_880._0_4_ = fVar349;
    fVar280 = auVar188._8_4_;
    fVar355 = fVar280 * auVar96._8_4_ * 3.0;
    fStack_878 = fVar355;
    fVar203 = auVar188._12_4_;
    fVar356 = fVar203 * auVar96._12_4_ * 3.0;
    fStack_874 = fVar356;
    fVar357 = fVar252 * auVar96._16_4_ * 3.0;
    unique0x100079f4 = fVar357;
    fVar358 = fVar255 * auVar96._20_4_ * 3.0;
    unique0x100079f8 = fVar358;
    fVar359 = fVar280 * auVar96._24_4_ * 3.0;
    unique0x100079fc = fVar359;
    unique0x10007a00 = fVar360;
    fVar337 = fVar252 * auVar351._0_4_ * 3.0;
    fVar341 = fVar255 * auVar351._4_4_ * 3.0;
    auVar21._4_4_ = fVar341;
    auVar21._0_4_ = fVar337;
    fVar342 = fVar280 * auVar351._8_4_ * 3.0;
    auVar21._8_4_ = fVar342;
    fVar343 = fVar203 * auVar351._12_4_ * 3.0;
    auVar21._12_4_ = fVar343;
    fVar344 = fVar252 * auVar351._16_4_ * 3.0;
    auVar21._16_4_ = fVar344;
    fVar345 = fVar255 * auVar351._20_4_ * 3.0;
    auVar21._20_4_ = fVar345;
    fVar346 = fVar280 * auVar351._24_4_ * 3.0;
    auVar21._24_4_ = fVar346;
    auVar21._28_4_ = auVar338._28_4_;
    fVar361 = fVar252 * auVar97._0_4_ * 3.0;
    fVar367 = fVar255 * auVar97._4_4_ * 3.0;
    local_a60._4_4_ = fVar367;
    local_a60._0_4_ = fVar361;
    fVar369 = fVar280 * auVar97._8_4_ * 3.0;
    local_a60._8_4_ = fVar369;
    fVar371 = fVar203 * auVar97._12_4_ * 3.0;
    local_a60._12_4_ = fVar371;
    fVar373 = fVar252 * auVar97._16_4_ * 3.0;
    local_a60._16_4_ = fVar373;
    fVar376 = fVar255 * auVar97._20_4_ * 3.0;
    local_a60._20_4_ = fVar376;
    fVar379 = fVar280 * auVar97._24_4_ * 3.0;
    local_a60._24_4_ = fVar379;
    local_a60._28_4_ = fVar382;
    fVar197 = fVar252 * auVar138._0_4_ * 3.0;
    fVar277 = fVar255 * auVar138._4_4_ * 3.0;
    auVar365._4_4_ = fVar277;
    auVar365._0_4_ = fVar197;
    fVar199 = fVar280 * auVar138._8_4_ * 3.0;
    auVar365._8_4_ = fVar199;
    fVar205 = fVar203 * auVar138._12_4_ * 3.0;
    auVar365._12_4_ = fVar205;
    fVar252 = fVar252 * auVar138._16_4_ * 3.0;
    auVar365._16_4_ = fVar252;
    fVar255 = fVar255 * auVar138._20_4_ * 3.0;
    auVar365._20_4_ = fVar255;
    fVar280 = fVar280 * auVar138._24_4_ * 3.0;
    auVar365._24_4_ = fVar280;
    auVar365._28_4_ = fVar203;
    auVar96 = vperm2f128_avx(auVar387,auVar387,1);
    auVar96 = vshufps_avx(auVar96,auVar387,0x30);
    auVar138 = vshufps_avx(auVar387,auVar96,0x29);
    auVar96 = vperm2f128_avx(auVar384,auVar384,1);
    auVar96 = vshufps_avx(auVar96,auVar384,0x30);
    auVar191 = vshufps_avx(auVar384,auVar96,0x29);
    auVar351 = vsubps_avx(local_6c0,auVar365);
    auVar96 = vperm2f128_avx(auVar351,auVar351,1);
    auVar96 = vshufps_avx(auVar96,auVar351,0x30);
    auVar365 = vshufps_avx(auVar351,auVar96,0x29);
    auVar16 = vsubps_avx(auVar138,auVar387);
    auVar17 = vsubps_avx(auVar191,auVar384);
    fVar174 = auVar16._0_4_;
    fVar198 = auVar16._4_4_;
    auVar15._4_4_ = fVar367 * fVar198;
    auVar15._0_4_ = fVar361 * fVar174;
    fVar200 = auVar16._8_4_;
    auVar15._8_4_ = fVar369 * fVar200;
    fVar224 = auVar16._12_4_;
    auVar15._12_4_ = fVar371 * fVar224;
    fVar250 = auVar16._16_4_;
    auVar15._16_4_ = fVar373 * fVar250;
    fVar266 = auVar16._20_4_;
    auVar15._20_4_ = fVar376 * fVar266;
    fVar287 = auVar16._24_4_;
    auVar15._24_4_ = fVar379 * fVar287;
    auVar15._28_4_ = auVar351._28_4_;
    fVar249 = auVar17._0_4_;
    fVar265 = auVar17._4_4_;
    auVar18._4_4_ = fVar341 * fVar265;
    auVar18._0_4_ = fVar337 * fVar249;
    fVar201 = auVar17._8_4_;
    auVar18._8_4_ = fVar342 * fVar201;
    fVar225 = auVar17._12_4_;
    auVar18._12_4_ = fVar343 * fVar225;
    fVar253 = auVar17._16_4_;
    auVar18._16_4_ = fVar344 * fVar253;
    fVar276 = auVar17._20_4_;
    auVar18._20_4_ = fVar345 * fVar276;
    fVar347 = auVar17._24_4_;
    auVar18._24_4_ = fVar346 * fVar347;
    auVar18._28_4_ = auVar96._28_4_;
    auVar97 = vsubps_avx(auVar18,auVar15);
    auVar62._4_4_ = fVar108;
    auVar62._0_4_ = fVar79;
    auVar62._8_4_ = fVar111;
    auVar62._12_4_ = fVar114;
    auVar62._16_4_ = fVar117;
    auVar62._20_4_ = fVar120;
    auVar62._24_4_ = fVar123;
    auVar62._28_4_ = fVar126;
    auVar96 = vperm2f128_avx(auVar62,auVar62,1);
    auVar96 = vshufps_avx(auVar96,auVar62,0x30);
    auVar15 = vshufps_avx(auVar62,auVar96,0x29);
    auVar351 = vsubps_avx(auVar15,auVar62);
    auVar311._4_4_ = fVar354 * fVar265;
    auVar311._0_4_ = fVar349 * fVar249;
    auVar311._8_4_ = fVar355 * fVar201;
    auVar311._12_4_ = fVar356 * fVar225;
    auVar311._16_4_ = fVar357 * fVar253;
    auVar311._20_4_ = fVar358 * fVar276;
    auVar311._24_4_ = fVar359 * fVar347;
    auVar311._28_4_ = auVar96._28_4_;
    fVar196 = auVar351._0_4_;
    fVar275 = auVar351._4_4_;
    auVar312._4_4_ = fVar367 * fVar275;
    auVar312._0_4_ = fVar361 * fVar196;
    fVar202 = auVar351._8_4_;
    auVar312._8_4_ = fVar369 * fVar202;
    fVar226 = auVar351._12_4_;
    auVar312._12_4_ = fVar371 * fVar226;
    fVar256 = auVar351._16_4_;
    auVar312._16_4_ = fVar373 * fVar256;
    fVar278 = auVar351._20_4_;
    auVar312._20_4_ = fVar376 * fVar278;
    fVar12 = auVar351._24_4_;
    auVar312._24_4_ = fVar379 * fVar12;
    auVar312._28_4_ = auVar191._28_4_;
    auVar18 = vsubps_avx(auVar312,auVar311);
    auVar19._4_4_ = fVar341 * fVar275;
    auVar19._0_4_ = fVar337 * fVar196;
    auVar19._8_4_ = fVar342 * fVar202;
    auVar19._12_4_ = fVar343 * fVar226;
    auVar19._16_4_ = fVar344 * fVar256;
    auVar19._20_4_ = fVar345 * fVar278;
    auVar19._24_4_ = fVar346 * fVar12;
    auVar19._28_4_ = auVar191._28_4_;
    auVar335._4_4_ = fVar354 * fVar198;
    auVar335._0_4_ = fVar349 * fVar174;
    auVar335._8_4_ = fVar355 * fVar200;
    auVar335._12_4_ = fVar356 * fVar224;
    auVar335._16_4_ = fVar357 * fVar250;
    auVar335._20_4_ = fVar358 * fVar266;
    auVar335._24_4_ = fVar359 * fVar287;
    auVar335._28_4_ = auVar333._28_4_;
    auVar311 = vsubps_avx(auVar335,auVar19);
    fVar229 = auVar311._28_4_;
    auVar165._0_4_ = fVar196 * fVar196 + fVar174 * fVar174 + fVar249 * fVar249;
    auVar165._4_4_ = fVar275 * fVar275 + fVar198 * fVar198 + fVar265 * fVar265;
    auVar165._8_4_ = fVar202 * fVar202 + fVar200 * fVar200 + fVar201 * fVar201;
    auVar165._12_4_ = fVar226 * fVar226 + fVar224 * fVar224 + fVar225 * fVar225;
    auVar165._16_4_ = fVar256 * fVar256 + fVar250 * fVar250 + fVar253 * fVar253;
    auVar165._20_4_ = fVar278 * fVar278 + fVar266 * fVar266 + fVar276 * fVar276;
    auVar165._24_4_ = fVar12 * fVar12 + fVar287 * fVar287 + fVar347 * fVar347;
    auVar165._28_4_ = fVar229 + fVar229 + auVar97._28_4_;
    auVar96 = vrcpps_avx(auVar165);
    fVar223 = auVar96._0_4_;
    fVar227 = auVar96._4_4_;
    auVar20._4_4_ = fVar227 * auVar165._4_4_;
    auVar20._0_4_ = fVar223 * auVar165._0_4_;
    fVar228 = auVar96._8_4_;
    auVar20._8_4_ = fVar228 * auVar165._8_4_;
    fVar230 = auVar96._12_4_;
    auVar20._12_4_ = fVar230 * auVar165._12_4_;
    fVar258 = auVar96._16_4_;
    auVar20._16_4_ = fVar258 * auVar165._16_4_;
    fVar260 = auVar96._20_4_;
    auVar20._20_4_ = fVar260 * auVar165._20_4_;
    fVar262 = auVar96._24_4_;
    auVar20._24_4_ = fVar262 * auVar165._24_4_;
    auVar20._28_4_ = auVar333._28_4_;
    auVar98._8_4_ = 0x3f800000;
    auVar98._0_8_ = 0x3f8000003f800000;
    auVar98._12_4_ = 0x3f800000;
    auVar98._16_4_ = 0x3f800000;
    auVar98._20_4_ = 0x3f800000;
    auVar98._24_4_ = 0x3f800000;
    auVar98._28_4_ = 0x3f800000;
    auVar312 = vsubps_avx(auVar98,auVar20);
    fVar223 = auVar312._0_4_ * fVar223 + fVar223;
    fVar227 = auVar312._4_4_ * fVar227 + fVar227;
    fVar228 = auVar312._8_4_ * fVar228 + fVar228;
    fVar230 = auVar312._12_4_ * fVar230 + fVar230;
    fVar258 = auVar312._16_4_ * fVar258 + fVar258;
    fVar260 = auVar312._20_4_ * fVar260 + fVar260;
    fVar262 = auVar312._24_4_ * fVar262 + fVar262;
    auVar351 = vperm2f128_avx(auVar21,auVar21,1);
    auVar351 = vshufps_avx(auVar351,auVar21,0x30);
    local_a80 = vshufps_avx(auVar21,auVar351,0x29);
    auVar351 = vperm2f128_avx(local_a60,local_a60,1);
    auVar351 = vshufps_avx(auVar351,local_a60,0x30);
    local_820 = vshufps_avx(local_a60,auVar351,0x29);
    fVar80 = local_820._0_4_;
    fVar109 = local_820._4_4_;
    auVar22._4_4_ = fVar109 * fVar198;
    auVar22._0_4_ = fVar80 * fVar174;
    fVar112 = local_820._8_4_;
    auVar22._8_4_ = fVar112 * fVar200;
    fVar115 = local_820._12_4_;
    auVar22._12_4_ = fVar115 * fVar224;
    fVar118 = local_820._16_4_;
    auVar22._16_4_ = fVar118 * fVar250;
    fVar121 = local_820._20_4_;
    auVar22._20_4_ = fVar121 * fVar266;
    fVar124 = local_820._24_4_;
    auVar22._24_4_ = fVar124 * fVar287;
    auVar22._28_4_ = auVar351._28_4_;
    fVar128 = local_a80._0_4_;
    fVar147 = local_a80._4_4_;
    auVar23._4_4_ = fVar147 * fVar265;
    auVar23._0_4_ = fVar128 * fVar249;
    fVar149 = local_a80._8_4_;
    auVar23._8_4_ = fVar149 * fVar201;
    fVar152 = local_a80._12_4_;
    auVar23._12_4_ = fVar152 * fVar225;
    fVar153 = local_a80._16_4_;
    auVar23._16_4_ = fVar153 * fVar253;
    fVar154 = local_a80._20_4_;
    auVar23._20_4_ = fVar154 * fVar276;
    fVar155 = local_a80._24_4_;
    auVar23._24_4_ = fVar155 * fVar347;
    auVar23._28_4_ = auVar338._28_4_;
    auVar19 = vsubps_avx(auVar23,auVar22);
    auVar351 = vperm2f128_avx(_local_880,_local_880,1);
    auVar351 = vshufps_avx(auVar351,_local_880,0x30);
    local_800 = vshufps_avx(_local_880,auVar351,0x29);
    fVar362 = local_800._0_4_;
    fVar368 = local_800._4_4_;
    auVar24._4_4_ = fVar368 * fVar265;
    auVar24._0_4_ = fVar362 * fVar249;
    fVar370 = local_800._8_4_;
    auVar24._8_4_ = fVar370 * fVar201;
    fVar372 = local_800._12_4_;
    auVar24._12_4_ = fVar372 * fVar225;
    fVar374 = local_800._16_4_;
    auVar24._16_4_ = fVar374 * fVar253;
    fVar377 = local_800._20_4_;
    auVar24._20_4_ = fVar377 * fVar276;
    fVar380 = local_800._24_4_;
    auVar24._24_4_ = fVar380 * fVar347;
    auVar24._28_4_ = auVar351._28_4_;
    auVar25._4_4_ = fVar275 * fVar109;
    auVar25._0_4_ = fVar196 * fVar80;
    auVar25._8_4_ = fVar202 * fVar112;
    auVar25._12_4_ = fVar226 * fVar115;
    auVar25._16_4_ = fVar256 * fVar118;
    auVar25._20_4_ = fVar278 * fVar121;
    auVar25._24_4_ = fVar12 * fVar124;
    auVar25._28_4_ = fVar360;
    auVar351 = vsubps_avx(auVar25,auVar24);
    auVar26._4_4_ = fVar275 * fVar147;
    auVar26._0_4_ = fVar196 * fVar128;
    auVar26._8_4_ = fVar202 * fVar149;
    auVar26._12_4_ = fVar226 * fVar152;
    auVar26._16_4_ = fVar256 * fVar153;
    auVar26._20_4_ = fVar278 * fVar154;
    auVar26._24_4_ = fVar12 * fVar155;
    auVar26._28_4_ = fVar360;
    auVar28._4_4_ = fVar368 * fVar198;
    auVar28._0_4_ = fVar362 * fVar174;
    auVar28._8_4_ = fVar370 * fVar200;
    auVar28._12_4_ = fVar372 * fVar224;
    auVar28._16_4_ = fVar374 * fVar250;
    auVar28._20_4_ = fVar377 * fVar266;
    fVar27 = local_800._28_4_;
    auVar28._24_4_ = fVar380 * fVar287;
    auVar28._28_4_ = fVar27;
    auVar335 = vsubps_avx(auVar28,auVar26);
    fVar264 = auVar335._28_4_;
    fVar348 = auVar351._28_4_ + fVar264;
    auVar29._4_4_ =
         (auVar97._4_4_ * auVar97._4_4_ +
         auVar18._4_4_ * auVar18._4_4_ + auVar311._4_4_ * auVar311._4_4_) * fVar227;
    auVar29._0_4_ =
         (auVar97._0_4_ * auVar97._0_4_ +
         auVar18._0_4_ * auVar18._0_4_ + auVar311._0_4_ * auVar311._0_4_) * fVar223;
    auVar29._8_4_ =
         (auVar97._8_4_ * auVar97._8_4_ +
         auVar18._8_4_ * auVar18._8_4_ + auVar311._8_4_ * auVar311._8_4_) * fVar228;
    auVar29._12_4_ =
         (auVar97._12_4_ * auVar97._12_4_ +
         auVar18._12_4_ * auVar18._12_4_ + auVar311._12_4_ * auVar311._12_4_) * fVar230;
    auVar29._16_4_ =
         (auVar97._16_4_ * auVar97._16_4_ +
         auVar18._16_4_ * auVar18._16_4_ + auVar311._16_4_ * auVar311._16_4_) * fVar258;
    auVar29._20_4_ =
         (auVar97._20_4_ * auVar97._20_4_ +
         auVar18._20_4_ * auVar18._20_4_ + auVar311._20_4_ * auVar311._20_4_) * fVar260;
    auVar29._24_4_ =
         (auVar97._24_4_ * auVar97._24_4_ +
         auVar18._24_4_ * auVar18._24_4_ + auVar311._24_4_ * auVar311._24_4_) * fVar262;
    auVar29._28_4_ = auVar97._28_4_ + auVar18._28_4_ + fVar229;
    auVar30._4_4_ =
         (auVar19._4_4_ * auVar19._4_4_ +
         auVar351._4_4_ * auVar351._4_4_ + auVar335._4_4_ * auVar335._4_4_) * fVar227;
    auVar30._0_4_ =
         (auVar19._0_4_ * auVar19._0_4_ +
         auVar351._0_4_ * auVar351._0_4_ + auVar335._0_4_ * auVar335._0_4_) * fVar223;
    auVar30._8_4_ =
         (auVar19._8_4_ * auVar19._8_4_ +
         auVar351._8_4_ * auVar351._8_4_ + auVar335._8_4_ * auVar335._8_4_) * fVar228;
    auVar30._12_4_ =
         (auVar19._12_4_ * auVar19._12_4_ +
         auVar351._12_4_ * auVar351._12_4_ + auVar335._12_4_ * auVar335._12_4_) * fVar230;
    auVar30._16_4_ =
         (auVar19._16_4_ * auVar19._16_4_ +
         auVar351._16_4_ * auVar351._16_4_ + auVar335._16_4_ * auVar335._16_4_) * fVar258;
    auVar30._20_4_ =
         (auVar19._20_4_ * auVar19._20_4_ +
         auVar351._20_4_ * auVar351._20_4_ + auVar335._20_4_ * auVar335._20_4_) * fVar260;
    auVar30._24_4_ =
         (auVar19._24_4_ * auVar19._24_4_ +
         auVar351._24_4_ * auVar351._24_4_ + auVar335._24_4_ * auVar335._24_4_) * fVar262;
    auVar30._28_4_ = auVar312._28_4_ + auVar96._28_4_;
    auVar96 = vmaxps_avx(auVar29,auVar30);
    auVar351 = vperm2f128_avx(local_6c0,local_6c0,1);
    auVar351 = vshufps_avx(auVar351,local_6c0,0x30);
    auVar18 = vshufps_avx(local_6c0,auVar351,0x29);
    auVar99._0_4_ = (float)local_6c0._0_4_ + fVar197;
    auVar99._4_4_ = local_6c0._4_4_ + fVar277;
    auVar99._8_4_ = local_6c0._8_4_ + fVar199;
    auVar99._12_4_ = local_6c0._12_4_ + fVar205;
    auVar99._16_4_ = local_6c0._16_4_ + fVar252;
    auVar99._20_4_ = local_6c0._20_4_ + fVar255;
    auVar99._24_4_ = local_6c0._24_4_ + fVar280;
    auVar99._28_4_ = local_6c0._28_4_ + fVar203;
    auVar351 = vmaxps_avx(local_6c0,auVar99);
    auVar97 = vmaxps_avx(auVar365,auVar18);
    auVar351 = vmaxps_avx(auVar351,auVar97);
    auVar97 = vrsqrtps_avx(auVar165);
    fVar229 = auVar97._0_4_;
    fVar252 = auVar97._4_4_;
    fVar197 = auVar97._8_4_;
    fVar255 = auVar97._12_4_;
    fVar277 = auVar97._16_4_;
    fVar280 = auVar97._20_4_;
    fVar199 = auVar97._24_4_;
    local_3e0 = fVar229 * 1.5 + fVar229 * fVar229 * fVar229 * auVar165._0_4_ * -0.5;
    fStack_3dc = fVar252 * 1.5 + fVar252 * fVar252 * fVar252 * auVar165._4_4_ * -0.5;
    fStack_3d8 = fVar197 * 1.5 + fVar197 * fVar197 * fVar197 * auVar165._8_4_ * -0.5;
    fStack_3d4 = fVar255 * 1.5 + fVar255 * fVar255 * fVar255 * auVar165._12_4_ * -0.5;
    fStack_3d0 = fVar277 * 1.5 + fVar277 * fVar277 * fVar277 * auVar165._16_4_ * -0.5;
    fStack_3cc = fVar280 * 1.5 + fVar280 * fVar280 * fVar280 * auVar165._20_4_ * -0.5;
    fStack_3c8 = fVar199 * 1.5 + fVar199 * fVar199 * fVar199 * auVar165._24_4_ * -0.5;
    auVar311 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_840 = vsubps_avx(auVar311,auVar387);
    fVar204 = local_840._28_4_;
    local_660 = vsubps_avx(auVar311,auVar384);
    fVar252 = local_660._0_4_;
    fVar277 = local_660._4_4_;
    fVar203 = local_660._8_4_;
    fVar227 = local_660._12_4_;
    fVar258 = local_660._16_4_;
    fVar281 = local_660._20_4_;
    fVar375 = local_660._24_4_;
    fVar197 = local_840._0_4_;
    fVar280 = local_840._4_4_;
    fVar205 = local_840._8_4_;
    fVar228 = local_840._12_4_;
    fVar260 = local_840._16_4_;
    fVar283 = local_840._20_4_;
    fVar378 = local_840._24_4_;
    auVar63._4_4_ = fVar108;
    auVar63._0_4_ = fVar79;
    auVar63._8_4_ = fVar111;
    auVar63._12_4_ = fVar114;
    auVar63._16_4_ = fVar117;
    auVar63._20_4_ = fVar120;
    auVar63._24_4_ = fVar123;
    auVar63._28_4_ = fVar126;
    auVar312 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar311 = vsubps_avx(auVar312,auVar63);
    fVar255 = auVar311._0_4_;
    fVar199 = auVar311._4_4_;
    fVar223 = auVar311._8_4_;
    fVar230 = auVar311._12_4_;
    fVar262 = auVar311._16_4_;
    fVar285 = auVar311._20_4_;
    fVar381 = auVar311._24_4_;
    auVar334._0_4_ = local_6e0 * fVar255 + local_700 * fVar197 + local_720 * fVar252;
    auVar334._4_4_ = fStack_6dc * fVar199 + fStack_6fc * fVar280 + fStack_71c * fVar277;
    auVar334._8_4_ = fStack_6d8 * fVar223 + fStack_6f8 * fVar205 + fStack_718 * fVar203;
    auVar334._12_4_ = fStack_6d4 * fVar230 + fStack_6f4 * fVar228 + fStack_714 * fVar227;
    auVar334._16_4_ = fStack_6d0 * fVar262 + fStack_6f0 * fVar260 + fStack_710 * fVar258;
    auVar334._20_4_ = fStack_6cc * fVar285 + fStack_6ec * fVar283 + fStack_70c * fVar281;
    auVar334._24_4_ = fStack_6c8 * fVar381 + fStack_6e8 * fVar378 + fStack_708 * fVar375;
    auVar334._28_4_ = fVar264 + fVar348 + auVar19._28_4_ + fVar348;
    auVar352._0_4_ = fVar255 * fVar255 + fVar197 * fVar197 + fVar252 * fVar252;
    auVar352._4_4_ = fVar199 * fVar199 + fVar280 * fVar280 + fVar277 * fVar277;
    auVar352._8_4_ = fVar223 * fVar223 + fVar205 * fVar205 + fVar203 * fVar203;
    auVar352._12_4_ = fVar230 * fVar230 + fVar228 * fVar228 + fVar227 * fVar227;
    auVar352._16_4_ = fVar262 * fVar262 + fVar260 * fVar260 + fVar258 * fVar258;
    auVar352._20_4_ = fVar285 * fVar285 + fVar283 * fVar283 + fVar281 * fVar281;
    auVar352._24_4_ = fVar381 * fVar381 + fVar378 * fVar378 + fVar375 * fVar375;
    auVar352._28_4_ = fVar27 + fVar27 + fVar264;
    fVar229 = auVar17._28_4_;
    fVar315 = local_6e0 * fVar196 * local_3e0 +
              fVar174 * local_3e0 * local_700 + fVar249 * local_3e0 * local_720;
    fVar323 = fStack_6dc * fVar275 * fStack_3dc +
              fVar198 * fStack_3dc * fStack_6fc + fVar265 * fStack_3dc * fStack_71c;
    fVar324 = fStack_6d8 * fVar202 * fStack_3d8 +
              fVar200 * fStack_3d8 * fStack_6f8 + fVar201 * fStack_3d8 * fStack_718;
    fVar325 = fStack_6d4 * fVar226 * fStack_3d4 +
              fVar224 * fStack_3d4 * fStack_6f4 + fVar225 * fStack_3d4 * fStack_714;
    fVar326 = fStack_6d0 * fVar256 * fStack_3d0 +
              fVar250 * fStack_3d0 * fStack_6f0 + fVar253 * fStack_3d0 * fStack_710;
    fVar328 = fStack_6cc * fVar278 * fStack_3cc +
              fVar266 * fStack_3cc * fStack_6ec + fVar276 * fStack_3cc * fStack_70c;
    fVar330 = fStack_6c8 * fVar12 * fStack_3c8 +
              fVar287 * fStack_3c8 * fStack_6e8 + fVar347 * fStack_3c8 * fStack_708;
    fVar264 = auVar16._28_4_ + fVar229 + fStack_704;
    fVar289 = fVar255 * fVar196 * local_3e0 +
              fVar174 * local_3e0 * fVar197 + fVar249 * local_3e0 * fVar252;
    fVar303 = fVar199 * fVar275 * fStack_3dc +
              fVar198 * fStack_3dc * fVar280 + fVar265 * fStack_3dc * fVar277;
    fVar304 = fVar223 * fVar202 * fStack_3d8 +
              fVar200 * fStack_3d8 * fVar205 + fVar201 * fStack_3d8 * fVar203;
    fVar305 = fVar230 * fVar226 * fStack_3d4 +
              fVar224 * fStack_3d4 * fVar228 + fVar225 * fStack_3d4 * fVar227;
    fVar306 = fVar262 * fVar256 * fStack_3d0 +
              fVar250 * fStack_3d0 * fVar260 + fVar253 * fStack_3d0 * fVar258;
    fVar307 = fVar285 * fVar278 * fStack_3cc +
              fVar266 * fStack_3cc * fVar283 + fVar276 * fStack_3cc * fVar281;
    fVar308 = fVar381 * fVar12 * fStack_3c8 +
              fVar287 * fStack_3c8 * fVar378 + fVar347 * fStack_3c8 * fVar375;
    fVar309 = fVar229 + fVar264;
    auVar16._4_4_ = fVar323 * fVar303;
    auVar16._0_4_ = fVar315 * fVar289;
    auVar16._8_4_ = fVar324 * fVar304;
    auVar16._12_4_ = fVar325 * fVar305;
    auVar16._16_4_ = fVar326 * fVar306;
    auVar16._20_4_ = fVar328 * fVar307;
    auVar16._24_4_ = fVar330 * fVar308;
    auVar16._28_4_ = fVar264;
    auVar17 = vsubps_avx(auVar334,auVar16);
    auVar31._4_4_ = fVar303 * fVar303;
    auVar31._0_4_ = fVar289 * fVar289;
    auVar31._8_4_ = fVar304 * fVar304;
    auVar31._12_4_ = fVar305 * fVar305;
    auVar31._16_4_ = fVar306 * fVar306;
    auVar31._20_4_ = fVar307 * fVar307;
    auVar31._24_4_ = fVar308 * fVar308;
    auVar31._28_4_ = fVar229;
    auVar311 = vsubps_avx(auVar352,auVar31);
    auVar274 = ZEXT3264(auVar311);
    auVar16 = vsqrtps_avx(auVar96);
    fVar229 = (auVar16._0_4_ + auVar351._0_4_) * 1.0000002;
    fVar264 = (auVar16._4_4_ + auVar351._4_4_) * 1.0000002;
    fVar348 = (auVar16._8_4_ + auVar351._8_4_) * 1.0000002;
    fVar116 = (auVar16._12_4_ + auVar351._12_4_) * 1.0000002;
    fVar119 = (auVar16._16_4_ + auVar351._16_4_) * 1.0000002;
    fVar122 = (auVar16._20_4_ + auVar351._20_4_) * 1.0000002;
    fVar125 = (auVar16._24_4_ + auVar351._24_4_) * 1.0000002;
    auVar32._4_4_ = fVar264 * fVar264;
    auVar32._0_4_ = fVar229 * fVar229;
    auVar32._8_4_ = fVar348 * fVar348;
    auVar32._12_4_ = fVar116 * fVar116;
    auVar32._16_4_ = fVar119 * fVar119;
    auVar32._20_4_ = fVar122 * fVar122;
    auVar32._24_4_ = fVar125 * fVar125;
    auVar32._28_4_ = auVar16._28_4_ + auVar351._28_4_;
    fVar264 = auVar17._0_4_ + auVar17._0_4_;
    fVar348 = auVar17._4_4_ + auVar17._4_4_;
    local_360._0_8_ = CONCAT44(fVar348,fVar264);
    local_360._8_4_ = auVar17._8_4_ + auVar17._8_4_;
    local_360._12_4_ = auVar17._12_4_ + auVar17._12_4_;
    local_360._16_4_ = auVar17._16_4_ + auVar17._16_4_;
    local_360._20_4_ = auVar17._20_4_ + auVar17._20_4_;
    local_360._24_4_ = auVar17._24_4_ + auVar17._24_4_;
    local_360._28_4_ = auVar17._28_4_ + auVar17._28_4_;
    auVar351 = vsubps_avx(auVar311,auVar32);
    local_340._4_4_ = fVar323 * fVar323;
    local_340._0_4_ = fVar315 * fVar315;
    local_340._8_4_ = fVar324 * fVar324;
    local_340._12_4_ = fVar325 * fVar325;
    local_340._16_4_ = fVar326 * fVar326;
    local_340._20_4_ = fVar328 * fVar328;
    local_340._24_4_ = fVar330 * fVar330;
    local_340._28_4_ = fStack_6c4;
    local_400 = vsubps_avx(local_200,local_340);
    auVar33._4_4_ = fVar348 * fVar348;
    auVar33._0_4_ = fVar264 * fVar264;
    auVar33._8_4_ = local_360._8_4_ * local_360._8_4_;
    auVar33._12_4_ = local_360._12_4_ * local_360._12_4_;
    auVar33._16_4_ = local_360._16_4_ * local_360._16_4_;
    auVar33._20_4_ = local_360._20_4_ * local_360._20_4_;
    auVar33._24_4_ = local_360._24_4_ * local_360._24_4_;
    auVar33._28_4_ = 0x3f800002;
    fVar116 = local_400._0_4_;
    fVar119 = local_400._4_4_;
    fVar122 = local_400._8_4_;
    fVar125 = local_400._12_4_;
    fVar327 = local_400._16_4_;
    fVar329 = local_400._20_4_;
    fVar331 = local_400._24_4_;
    auVar17._4_4_ = auVar351._4_4_ * fVar119 * 4.0;
    auVar17._0_4_ = auVar351._0_4_ * fVar116 * 4.0;
    auVar17._8_4_ = auVar351._8_4_ * fVar122 * 4.0;
    auVar17._12_4_ = auVar351._12_4_ * fVar125 * 4.0;
    auVar17._16_4_ = auVar351._16_4_ * fVar327 * 4.0;
    auVar17._20_4_ = auVar351._20_4_ * fVar329 * 4.0;
    auVar17._24_4_ = auVar351._24_4_ * fVar331 * 4.0;
    auVar17._28_4_ = 0x40800000;
    auVar17 = vsubps_avx(auVar33,auVar17);
    auVar96 = vcmpps_avx(auVar17,auVar312,5);
    fVar229 = local_400._28_4_;
    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar96 >> 0x7f,0) == '\0') &&
          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar96 >> 0xbf,0) == '\0') &&
        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar96[0x1f]) {
      auVar364._8_4_ = 0x7f800000;
      auVar364._0_8_ = 0x7f8000007f800000;
      auVar364._12_4_ = 0x7f800000;
      auVar364._16_4_ = 0x7f800000;
      auVar364._20_4_ = 0x7f800000;
      auVar364._24_4_ = 0x7f800000;
      auVar364._28_4_ = 0x7f800000;
      auVar218._8_4_ = 0xff800000;
      auVar218._0_8_ = 0xff800000ff800000;
      auVar218._12_4_ = 0xff800000;
      auVar218._16_4_ = 0xff800000;
      auVar218._20_4_ = 0xff800000;
      auVar218._24_4_ = 0xff800000;
      auVar218._28_4_ = 0xff800000;
      auVar332._4_4_ = fStack_6fc;
      auVar332._0_4_ = local_700;
      auVar332._8_4_ = fStack_6f8;
      auVar332._12_4_ = fStack_6f4;
      auVar332._16_4_ = fStack_6f0;
      auVar332._20_4_ = fStack_6ec;
      auVar332._24_4_ = fStack_6e8;
      auVar383._4_4_ = fStack_71c;
      auVar383._0_4_ = local_720;
      auVar383._8_4_ = fStack_718;
      auVar383._12_4_ = fStack_714;
      auVar383._16_4_ = fStack_710;
      auVar383._20_4_ = fStack_70c;
      auVar383._24_4_ = fStack_708;
    }
    else {
      auVar312 = vcmpps_avx(auVar17,auVar312,5);
      auVar19 = vsqrtps_avx(auVar17);
      auVar239._0_4_ = fVar116 + fVar116;
      auVar239._4_4_ = fVar119 + fVar119;
      auVar239._8_4_ = fVar122 + fVar122;
      auVar239._12_4_ = fVar125 + fVar125;
      auVar239._16_4_ = fVar327 + fVar327;
      auVar239._20_4_ = fVar329 + fVar329;
      auVar239._24_4_ = fVar331 + fVar331;
      auVar239._28_4_ = fVar229 + fVar229;
      auVar17 = vrcpps_avx(auVar239);
      fVar231 = auVar17._0_4_;
      fVar251 = auVar17._4_4_;
      auVar34._4_4_ = auVar239._4_4_ * fVar251;
      auVar34._0_4_ = auVar239._0_4_ * fVar231;
      fVar254 = auVar17._8_4_;
      auVar34._8_4_ = auVar239._8_4_ * fVar254;
      fVar257 = auVar17._12_4_;
      auVar34._12_4_ = auVar239._12_4_ * fVar257;
      fVar259 = auVar17._16_4_;
      auVar34._16_4_ = auVar239._16_4_ * fVar259;
      fVar261 = auVar17._20_4_;
      auVar34._20_4_ = auVar239._20_4_ * fVar261;
      fVar263 = auVar17._24_4_;
      auVar34._24_4_ = auVar239._24_4_ * fVar263;
      auVar34._28_4_ = auVar239._28_4_;
      auVar296._8_4_ = 0x3f800000;
      auVar296._0_8_ = 0x3f8000003f800000;
      auVar296._12_4_ = 0x3f800000;
      auVar296._16_4_ = 0x3f800000;
      auVar296._20_4_ = 0x3f800000;
      auVar296._24_4_ = 0x3f800000;
      auVar296._28_4_ = 0x3f800000;
      auVar335 = vsubps_avx(auVar296,auVar34);
      fVar231 = fVar231 + fVar231 * auVar335._0_4_;
      fVar251 = fVar251 + fVar251 * auVar335._4_4_;
      fVar254 = fVar254 + fVar254 * auVar335._8_4_;
      fVar257 = fVar257 + fVar257 * auVar335._12_4_;
      fVar259 = fVar259 + fVar259 * auVar335._16_4_;
      fVar261 = fVar261 + fVar261 * auVar335._20_4_;
      fVar263 = fVar263 + fVar263 * auVar335._24_4_;
      auVar271._0_8_ = CONCAT44(fVar348,fVar264) ^ 0x8000000080000000;
      auVar271._8_4_ = -local_360._8_4_;
      auVar271._12_4_ = -local_360._12_4_;
      auVar271._16_4_ = -local_360._16_4_;
      auVar271._20_4_ = -local_360._20_4_;
      auVar271._24_4_ = -local_360._24_4_;
      auVar271._28_4_ = -local_360._28_4_;
      auVar20 = vsubps_avx(auVar271,auVar19);
      fVar264 = auVar20._0_4_ * fVar231;
      fVar348 = auVar20._4_4_ * fVar251;
      auVar35._4_4_ = fVar348;
      auVar35._0_4_ = fVar264;
      fVar279 = auVar20._8_4_ * fVar254;
      auVar35._8_4_ = fVar279;
      fVar282 = auVar20._12_4_ * fVar257;
      auVar35._12_4_ = fVar282;
      fVar284 = auVar20._16_4_ * fVar259;
      auVar35._16_4_ = fVar284;
      fVar286 = auVar20._20_4_ * fVar261;
      auVar35._20_4_ = fVar286;
      fVar288 = auVar20._24_4_ * fVar263;
      auVar35._24_4_ = fVar288;
      auVar35._28_4_ = auVar20._28_4_;
      auVar274 = ZEXT3264(auVar35);
      auVar19 = vsubps_avx(auVar19,local_360);
      fVar231 = auVar19._0_4_ * fVar231;
      fVar251 = auVar19._4_4_ * fVar251;
      auVar36._4_4_ = fVar251;
      auVar36._0_4_ = fVar231;
      fVar254 = auVar19._8_4_ * fVar254;
      auVar36._8_4_ = fVar254;
      fVar257 = auVar19._12_4_ * fVar257;
      auVar36._12_4_ = fVar257;
      fVar259 = auVar19._16_4_ * fVar259;
      auVar36._16_4_ = fVar259;
      fVar261 = auVar19._20_4_ * fVar261;
      auVar36._20_4_ = fVar261;
      fVar263 = auVar19._24_4_ * fVar263;
      auVar36._24_4_ = fVar263;
      auVar36._28_4_ = auVar19._28_4_;
      fStack_5a4 = fVar309 + auVar17._28_4_ + auVar335._28_4_;
      local_5c0 = local_3e0 * (fVar289 + fVar315 * fVar264);
      fStack_5bc = fStack_3dc * (fVar303 + fVar323 * fVar348);
      fStack_5b8 = fStack_3d8 * (fVar304 + fVar324 * fVar279);
      fStack_5b4 = fStack_3d4 * (fVar305 + fVar325 * fVar282);
      fStack_5b0 = fStack_3d0 * (fVar306 + fVar326 * fVar284);
      fStack_5ac = fStack_3cc * (fVar307 + fVar328 * fVar286);
      fStack_5a8 = fStack_3c8 * (fVar308 + fVar330 * fVar288);
      auVar297._8_4_ = 0x7fffffff;
      auVar297._0_8_ = 0x7fffffff7fffffff;
      auVar297._12_4_ = 0x7fffffff;
      auVar297._16_4_ = 0x7fffffff;
      auVar297._20_4_ = 0x7fffffff;
      auVar297._24_4_ = 0x7fffffff;
      auVar297._28_4_ = 0x7fffffff;
      auVar17 = vandps_avx(local_340,auVar297);
      auVar17 = vmaxps_avx(local_3c0,auVar17);
      auVar37._4_4_ = auVar17._4_4_ * 1.9073486e-06;
      auVar37._0_4_ = auVar17._0_4_ * 1.9073486e-06;
      auVar37._8_4_ = auVar17._8_4_ * 1.9073486e-06;
      auVar37._12_4_ = auVar17._12_4_ * 1.9073486e-06;
      auVar37._16_4_ = auVar17._16_4_ * 1.9073486e-06;
      auVar37._20_4_ = auVar17._20_4_ * 1.9073486e-06;
      auVar37._24_4_ = auVar17._24_4_ * 1.9073486e-06;
      auVar37._28_4_ = auVar17._28_4_;
      auVar17 = vandps_avx(local_400,auVar297);
      auVar17 = vcmpps_avx(auVar17,auVar37,1);
      auVar298._8_4_ = 0x7f800000;
      auVar298._0_8_ = 0x7f8000007f800000;
      auVar298._12_4_ = 0x7f800000;
      auVar298._16_4_ = 0x7f800000;
      auVar298._20_4_ = 0x7f800000;
      auVar298._24_4_ = 0x7f800000;
      auVar298._28_4_ = 0x7f800000;
      auVar364 = vblendvps_avx(auVar298,auVar35,auVar312);
      local_320 = local_3e0 * (fVar289 + fVar315 * fVar231);
      fStack_31c = fStack_3dc * (fVar303 + fVar323 * fVar251);
      fStack_318 = fStack_3d8 * (fVar304 + fVar324 * fVar254);
      fStack_314 = fStack_3d4 * (fVar305 + fVar325 * fVar257);
      fStack_310 = fStack_3d0 * (fVar306 + fVar326 * fVar259);
      fStack_30c = fStack_3cc * (fVar307 + fVar328 * fVar261);
      fStack_308 = fStack_3c8 * (fVar308 + fVar330 * fVar263);
      fStack_304 = fVar309;
      auVar240._8_4_ = 0xff800000;
      auVar240._0_8_ = 0xff800000ff800000;
      auVar240._12_4_ = 0xff800000;
      auVar240._16_4_ = 0xff800000;
      auVar240._20_4_ = 0xff800000;
      auVar240._24_4_ = 0xff800000;
      auVar240._28_4_ = 0xff800000;
      auVar218 = vblendvps_avx(auVar240,auVar36,auVar312);
      auVar19 = auVar312 & auVar17;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar19 >> 0x7f,0) == '\0') &&
            (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar19 >> 0xbf,0) == '\0') &&
          (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f])
      {
        auVar332._4_4_ = fStack_6fc;
        auVar332._0_4_ = local_700;
        auVar332._8_4_ = fStack_6f8;
        auVar332._12_4_ = fStack_6f4;
        auVar332._16_4_ = fStack_6f0;
        auVar332._20_4_ = fStack_6ec;
        auVar332._24_4_ = fStack_6e8;
        auVar383._4_4_ = fStack_71c;
        auVar383._0_4_ = local_720;
        auVar383._8_4_ = fStack_718;
        auVar383._12_4_ = fStack_714;
        auVar383._16_4_ = fStack_710;
        auVar383._20_4_ = fStack_70c;
        auVar383._24_4_ = fStack_708;
      }
      else {
        auVar96 = vandps_avx(auVar17,auVar312);
        auVar188 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        fVar204 = 0.0;
        auVar17 = vcmpps_avx(auVar351,ZEXT832(0) << 0x20,2);
        auVar274 = ZEXT3264(auVar17);
        auVar353._8_4_ = 0xff800000;
        auVar353._0_8_ = 0xff800000ff800000;
        auVar353._12_4_ = 0xff800000;
        auVar353._16_4_ = 0xff800000;
        auVar353._20_4_ = 0xff800000;
        auVar353._24_4_ = 0xff800000;
        auVar353._28_4_ = 0xff800000;
        auVar314._8_4_ = 0x7f800000;
        auVar314._0_8_ = 0x7f8000007f800000;
        auVar314._12_4_ = 0x7f800000;
        auVar314._16_4_ = 0x7f800000;
        auVar314._20_4_ = 0x7f800000;
        auVar314._24_4_ = 0x7f800000;
        auVar314._28_4_ = 0x7f800000;
        auVar351 = vblendvps_avx(auVar314,auVar353,auVar17);
        auVar13 = vpmovsxwd_avx(auVar188);
        auVar188 = vpunpckhwd_avx(auVar188,auVar188);
        auVar248._16_16_ = auVar188;
        auVar248._0_16_ = auVar13;
        auVar364 = vblendvps_avx(auVar364,auVar351,auVar248);
        auVar351 = vblendvps_avx(auVar353,auVar314,auVar17);
        auVar218 = vblendvps_avx(auVar218,auVar351,auVar248);
        auVar351 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar105._0_4_ = auVar96._0_4_ ^ auVar351._0_4_;
        auVar105._4_4_ = auVar96._4_4_ ^ auVar351._4_4_;
        auVar105._8_4_ = auVar96._8_4_ ^ auVar351._8_4_;
        auVar105._12_4_ = auVar96._12_4_ ^ auVar351._12_4_;
        auVar105._16_4_ = auVar96._16_4_ ^ auVar351._16_4_;
        auVar105._20_4_ = auVar96._20_4_ ^ auVar351._20_4_;
        auVar105._24_4_ = auVar96._24_4_ ^ auVar351._24_4_;
        auVar105._28_4_ = auVar96._28_4_ ^ auVar351._28_4_;
        auVar96 = vorps_avx(auVar17,auVar105);
        auVar96 = vandps_avx(auVar312,auVar96);
        auVar332._4_4_ = fStack_6fc;
        auVar332._0_4_ = local_700;
        auVar332._8_4_ = fStack_6f8;
        auVar332._12_4_ = fStack_6f4;
        auVar332._16_4_ = fStack_6f0;
        auVar332._20_4_ = fStack_6ec;
        auVar332._24_4_ = fStack_6e8;
        auVar383._4_4_ = fStack_71c;
        auVar383._0_4_ = local_720;
        auVar383._8_4_ = fStack_718;
        auVar383._12_4_ = fStack_714;
        auVar383._16_4_ = fStack_710;
        auVar383._20_4_ = fStack_70c;
        auVar383._24_4_ = fStack_708;
      }
    }
    auVar351 = local_380 & auVar96;
    if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar351 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar351 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar351 >> 0x7f,0) == '\0') &&
          (auVar351 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar351 >> 0xbf,0) == '\0') &&
        (auVar351 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar351[0x1f])
    {
LAB_00e44fa9:
      auVar389 = ZEXT3264(local_8e0);
      auVar366 = ZEXT3264(local_9c0);
      auVar340 = ZEXT3264(local_a20);
      auVar336 = ZEXT3264(local_a00);
      auVar302 = ZEXT3264(local_9e0);
      auVar322 = ZEXT3264(local_900);
    }
    else {
      fStack_3c4 = auVar97._28_4_ + auVar165._28_4_;
      auVar188 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_7c0._0_4_));
      auVar188 = vshufps_avx(auVar188,auVar188,0);
      auVar241._16_16_ = auVar188;
      auVar241._0_16_ = auVar188;
      auVar17 = vmaxps_avx(auVar241,auVar364);
      auVar188 = ZEXT416((uint)(ray->tfar - (float)local_7c0._0_4_));
      auVar188 = vshufps_avx(auVar188,auVar188,0);
      auVar242._16_16_ = auVar188;
      auVar242._0_16_ = auVar188;
      auVar312 = vminps_avx(auVar242,auVar218);
      auVar139._0_4_ = local_6e0 * fVar349 + auVar332._0_4_ * fVar337 + auVar383._0_4_ * fVar361;
      auVar139._4_4_ = fStack_6dc * fVar354 + auVar332._4_4_ * fVar341 + auVar383._4_4_ * fVar367;
      auVar139._8_4_ = fStack_6d8 * fVar355 + auVar332._8_4_ * fVar342 + auVar383._8_4_ * fVar369;
      auVar139._12_4_ = fStack_6d4 * fVar356 + auVar332._12_4_ * fVar343 + auVar383._12_4_ * fVar371
      ;
      auVar139._16_4_ = fStack_6d0 * fVar357 + auVar332._16_4_ * fVar344 + auVar383._16_4_ * fVar373
      ;
      auVar139._20_4_ = fStack_6cc * fVar358 + auVar332._20_4_ * fVar345 + auVar383._20_4_ * fVar376
      ;
      auVar139._24_4_ = fStack_6c8 * fVar359 + auVar332._24_4_ * fVar346 + auVar383._24_4_ * fVar379
      ;
      auVar139._28_4_ = fVar204 + fVar382 + fVar204;
      auVar351 = vrcpps_avx(auVar139);
      fVar264 = auVar351._0_4_;
      fVar348 = auVar351._4_4_;
      auVar38._4_4_ = auVar139._4_4_ * fVar348;
      auVar38._0_4_ = auVar139._0_4_ * fVar264;
      fVar382 = auVar351._8_4_;
      auVar38._8_4_ = auVar139._8_4_ * fVar382;
      fVar231 = auVar351._12_4_;
      auVar38._12_4_ = auVar139._12_4_ * fVar231;
      fVar251 = auVar351._16_4_;
      auVar38._16_4_ = auVar139._16_4_ * fVar251;
      fVar254 = auVar351._20_4_;
      auVar38._20_4_ = auVar139._20_4_ * fVar254;
      fVar257 = auVar351._24_4_;
      auVar38._24_4_ = auVar139._24_4_ * fVar257;
      auVar38._28_4_ = fVar360;
      auVar320._8_4_ = 0x3f800000;
      auVar320._0_8_ = 0x3f8000003f800000;
      auVar320._12_4_ = 0x3f800000;
      auVar320._16_4_ = 0x3f800000;
      auVar320._20_4_ = 0x3f800000;
      auVar320._24_4_ = 0x3f800000;
      auVar320._28_4_ = 0x3f800000;
      auVar97 = vsubps_avx(auVar320,auVar38);
      auVar299._8_4_ = 0x7fffffff;
      auVar299._0_8_ = 0x7fffffff7fffffff;
      auVar299._12_4_ = 0x7fffffff;
      auVar299._16_4_ = 0x7fffffff;
      auVar299._20_4_ = 0x7fffffff;
      auVar299._24_4_ = 0x7fffffff;
      auVar299._28_4_ = 0x7fffffff;
      auVar351 = vandps_avx(auVar139,auVar299);
      auVar385._8_4_ = 0x219392ef;
      auVar385._0_8_ = 0x219392ef219392ef;
      auVar385._12_4_ = 0x219392ef;
      auVar385._16_4_ = 0x219392ef;
      auVar385._20_4_ = 0x219392ef;
      auVar385._24_4_ = 0x219392ef;
      auVar385._28_4_ = 0x219392ef;
      auVar351 = vcmpps_avx(auVar351,auVar385,1);
      auVar39._4_4_ =
           (fVar348 + fVar348 * auVar97._4_4_) *
           -(fVar199 * fVar354 + fVar341 * fVar280 + fVar367 * fVar277);
      auVar39._0_4_ =
           (fVar264 + fVar264 * auVar97._0_4_) *
           -(fVar255 * fVar349 + fVar337 * fVar197 + fVar361 * fVar252);
      auVar39._8_4_ =
           (fVar382 + fVar382 * auVar97._8_4_) *
           -(fVar223 * fVar355 + fVar342 * fVar205 + fVar369 * fVar203);
      auVar39._12_4_ =
           (fVar231 + fVar231 * auVar97._12_4_) *
           -(fVar230 * fVar356 + fVar343 * fVar228 + fVar371 * fVar227);
      auVar39._16_4_ =
           (fVar251 + fVar251 * auVar97._16_4_) *
           -(fVar262 * fVar357 + fVar344 * fVar260 + fVar373 * fVar258);
      auVar39._20_4_ =
           (fVar254 + fVar254 * auVar97._20_4_) *
           -(fVar285 * fVar358 + fVar345 * fVar283 + fVar376 * fVar281);
      auVar39._24_4_ =
           (fVar257 + fVar257 * auVar97._24_4_) *
           -(fVar381 * fVar359 + fVar346 * fVar378 + fVar379 * fVar375);
      auVar39._28_4_ = -(fVar204 + local_360._28_4_ + fVar204);
      auVar188 = ZEXT816(0) << 0x40;
      auVar97 = vcmpps_avx(auVar139,ZEXT1632(auVar188),1);
      auVar19 = vorps_avx(auVar351,auVar97);
      auVar97 = vcmpps_avx(auVar139,ZEXT1632(auVar188),6);
      auVar97 = vorps_avx(auVar351,auVar97);
      auVar313._8_4_ = 0xff800000;
      auVar313._0_8_ = 0xff800000ff800000;
      auVar313._12_4_ = 0xff800000;
      auVar313._16_4_ = 0xff800000;
      auVar313._20_4_ = 0xff800000;
      auVar313._24_4_ = 0xff800000;
      auVar313._28_4_ = 0xff800000;
      auVar351 = vblendvps_avx(auVar39,auVar313,auVar19);
      auVar339._8_4_ = 0x7f800000;
      auVar339._0_8_ = 0x7f8000007f800000;
      auVar339._12_4_ = 0x7f800000;
      auVar339._16_4_ = 0x7f800000;
      auVar339._20_4_ = 0x7f800000;
      auVar339._24_4_ = 0x7f800000;
      auVar339._28_4_ = 0x7f800000;
      auVar97 = vblendvps_avx(auVar39,auVar339,auVar97);
      auVar17 = vmaxps_avx(auVar17,auVar351);
      auVar312 = vminps_avx(auVar312,auVar97);
      auVar335 = ZEXT1632(auVar188);
      auVar351 = vsubps_avx(auVar335,auVar138);
      auVar97 = vsubps_avx(auVar335,auVar191);
      auVar40._4_4_ = auVar97._4_4_ * -fVar109;
      auVar40._0_4_ = auVar97._0_4_ * -fVar80;
      auVar40._8_4_ = auVar97._8_4_ * -fVar112;
      auVar40._12_4_ = auVar97._12_4_ * -fVar115;
      auVar40._16_4_ = auVar97._16_4_ * -fVar118;
      auVar40._20_4_ = auVar97._20_4_ * -fVar121;
      auVar40._24_4_ = auVar97._24_4_ * -fVar124;
      auVar40._28_4_ = auVar97._28_4_;
      auVar41._4_4_ = fVar147 * auVar351._4_4_;
      auVar41._0_4_ = fVar128 * auVar351._0_4_;
      auVar41._8_4_ = fVar149 * auVar351._8_4_;
      auVar41._12_4_ = fVar152 * auVar351._12_4_;
      auVar41._16_4_ = fVar153 * auVar351._16_4_;
      auVar41._20_4_ = fVar154 * auVar351._20_4_;
      auVar41._24_4_ = fVar155 * auVar351._24_4_;
      auVar41._28_4_ = auVar351._28_4_;
      auVar351 = vsubps_avx(auVar40,auVar41);
      auVar97 = vsubps_avx(auVar335,auVar15);
      auVar42._4_4_ = fVar368 * auVar97._4_4_;
      auVar42._0_4_ = fVar362 * auVar97._0_4_;
      auVar42._8_4_ = fVar370 * auVar97._8_4_;
      auVar42._12_4_ = fVar372 * auVar97._12_4_;
      auVar42._16_4_ = fVar374 * auVar97._16_4_;
      auVar42._20_4_ = fVar377 * auVar97._20_4_;
      uVar2 = auVar97._28_4_;
      auVar42._24_4_ = fVar380 * auVar97._24_4_;
      auVar42._28_4_ = uVar2;
      auVar138 = vsubps_avx(auVar351,auVar42);
      auVar43._4_4_ = auVar383._4_4_ * -fVar109;
      auVar43._0_4_ = auVar383._0_4_ * -fVar80;
      auVar43._8_4_ = auVar383._8_4_ * -fVar112;
      auVar43._12_4_ = auVar383._12_4_ * -fVar115;
      auVar43._16_4_ = auVar383._16_4_ * -fVar118;
      auVar43._20_4_ = auVar383._20_4_ * -fVar121;
      auVar43._24_4_ = auVar383._24_4_ * -fVar124;
      auVar43._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar321._8_4_ = 0x3f800000;
      auVar321._0_8_ = 0x3f8000003f800000;
      auVar321._12_4_ = 0x3f800000;
      auVar321._16_4_ = 0x3f800000;
      auVar321._20_4_ = 0x3f800000;
      auVar321._24_4_ = 0x3f800000;
      auVar321._28_4_ = 0x3f800000;
      auVar44._4_4_ = auVar332._4_4_ * fVar147;
      auVar44._0_4_ = auVar332._0_4_ * fVar128;
      auVar44._8_4_ = auVar332._8_4_ * fVar149;
      auVar44._12_4_ = auVar332._12_4_ * fVar152;
      auVar44._16_4_ = auVar332._16_4_ * fVar153;
      auVar44._20_4_ = auVar332._20_4_ * fVar154;
      auVar44._24_4_ = auVar332._24_4_ * fVar155;
      auVar44._28_4_ = uVar2;
      auVar351 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar368 * fStack_6dc;
      auVar45._0_4_ = fVar362 * local_6e0;
      auVar45._8_4_ = fVar370 * fStack_6d8;
      auVar45._12_4_ = fVar372 * fStack_6d4;
      auVar45._16_4_ = fVar374 * fStack_6d0;
      auVar45._20_4_ = fVar377 * fStack_6cc;
      auVar45._24_4_ = fVar380 * fStack_6c8;
      auVar45._28_4_ = uVar2;
      auVar191 = vsubps_avx(auVar351,auVar45);
      auVar351 = vrcpps_avx(auVar191);
      fVar252 = auVar351._0_4_;
      fVar197 = auVar351._4_4_;
      auVar46._4_4_ = auVar191._4_4_ * fVar197;
      auVar46._0_4_ = auVar191._0_4_ * fVar252;
      fVar255 = auVar351._8_4_;
      auVar46._8_4_ = auVar191._8_4_ * fVar255;
      fVar277 = auVar351._12_4_;
      auVar46._12_4_ = auVar191._12_4_ * fVar277;
      fVar280 = auVar351._16_4_;
      auVar46._16_4_ = auVar191._16_4_ * fVar280;
      fVar199 = auVar351._20_4_;
      auVar46._20_4_ = auVar191._20_4_ * fVar199;
      fVar203 = auVar351._24_4_;
      auVar46._24_4_ = auVar191._24_4_ * fVar203;
      auVar46._28_4_ = fStack_6c4;
      auVar19 = vsubps_avx(auVar321,auVar46);
      auVar351 = vandps_avx(auVar191,auVar299);
      auVar97 = vcmpps_avx(auVar351,auVar385,1);
      auVar274 = ZEXT3264(auVar97);
      auVar47._4_4_ = (fVar197 + fVar197 * auVar19._4_4_) * -auVar138._4_4_;
      auVar47._0_4_ = (fVar252 + fVar252 * auVar19._0_4_) * -auVar138._0_4_;
      auVar47._8_4_ = (fVar255 + fVar255 * auVar19._8_4_) * -auVar138._8_4_;
      auVar47._12_4_ = (fVar277 + fVar277 * auVar19._12_4_) * -auVar138._12_4_;
      auVar47._16_4_ = (fVar280 + fVar280 * auVar19._16_4_) * -auVar138._16_4_;
      auVar47._20_4_ = (fVar199 + fVar199 * auVar19._20_4_) * -auVar138._20_4_;
      auVar47._24_4_ = (fVar203 + fVar203 * auVar19._24_4_) * -auVar138._24_4_;
      auVar47._28_4_ = auVar138._28_4_ ^ 0x80000000;
      auVar351 = vcmpps_avx(auVar191,auVar335,1);
      auVar351 = vorps_avx(auVar97,auVar351);
      auVar351 = vblendvps_avx(auVar47,auVar313,auVar351);
      _local_5a0 = vmaxps_avx(auVar17,auVar351);
      auVar138 = ZEXT1632(auVar188);
      auVar351 = vcmpps_avx(auVar191,auVar138,6);
      auVar351 = vorps_avx(auVar97,auVar351);
      auVar351 = vblendvps_avx(auVar47,auVar339,auVar351);
      auVar96 = vandps_avx(auVar96,local_380);
      local_460 = vminps_avx(auVar312,auVar351);
      auVar351 = vcmpps_avx(_local_5a0,local_460,2);
      auVar97 = auVar96 & auVar351;
      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar97 >> 0x7f,0) == '\0') &&
            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0xbf,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f])
      goto LAB_00e44fa9;
      auVar97 = vminps_avx(local_6c0,auVar99);
      auVar191 = vminps_avx(auVar365,auVar18);
      auVar97 = vminps_avx(auVar97,auVar191);
      auVar97 = vsubps_avx(auVar97,auVar16);
      auVar96 = vandps_avx(auVar351,auVar96);
      auVar65._4_4_ = fStack_5bc;
      auVar65._0_4_ = local_5c0;
      auVar65._8_4_ = fStack_5b8;
      auVar65._12_4_ = fStack_5b4;
      auVar65._16_4_ = fStack_5b0;
      auVar65._20_4_ = fStack_5ac;
      auVar65._24_4_ = fStack_5a8;
      auVar65._28_4_ = fStack_5a4;
      auVar351 = vminps_avx(auVar65,auVar321);
      auVar351 = vmaxps_avx(auVar351,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar78 + fVar127 * (auVar351._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar107 + fVar146 * (auVar351._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar110 + fVar148 * (auVar351._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar113 + fVar151 * (auVar351._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar78 + fVar127 * (auVar351._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar107 + fVar146 * (auVar351._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar110 + fVar148 * (auVar351._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar113 + auVar351._28_4_ + 7.0;
      auVar66._4_4_ = fStack_31c;
      auVar66._0_4_ = local_320;
      auVar66._8_4_ = fStack_318;
      auVar66._12_4_ = fStack_314;
      auVar66._16_4_ = fStack_310;
      auVar66._20_4_ = fStack_30c;
      auVar66._24_4_ = fStack_308;
      auVar66._28_4_ = fStack_304;
      auVar351 = vminps_avx(auVar66,auVar321);
      auVar351 = vmaxps_avx(auVar351,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar78 + fVar127 * (auVar351._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar107 + fVar146 * (auVar351._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar110 + fVar148 * (auVar351._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar113 + fVar151 * (auVar351._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar78 + fVar127 * (auVar351._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar107 + fVar146 * (auVar351._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar110 + fVar148 * (auVar351._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar113 + auVar351._28_4_ + 7.0;
      auVar48._4_4_ = auVar97._4_4_ * 0.99999976;
      auVar48._0_4_ = auVar97._0_4_ * 0.99999976;
      auVar48._8_4_ = auVar97._8_4_ * 0.99999976;
      auVar48._12_4_ = auVar97._12_4_ * 0.99999976;
      auVar48._16_4_ = auVar97._16_4_ * 0.99999976;
      auVar48._20_4_ = auVar97._20_4_ * 0.99999976;
      auVar48._24_4_ = auVar97._24_4_ * 0.99999976;
      auVar48._28_4_ = 0x3f7ffffc;
      auVar351 = vmaxps_avx(auVar138,auVar48);
      auVar49._4_4_ = auVar351._4_4_ * auVar351._4_4_;
      auVar49._0_4_ = auVar351._0_4_ * auVar351._0_4_;
      auVar49._8_4_ = auVar351._8_4_ * auVar351._8_4_;
      auVar49._12_4_ = auVar351._12_4_ * auVar351._12_4_;
      auVar49._16_4_ = auVar351._16_4_ * auVar351._16_4_;
      auVar49._20_4_ = auVar351._20_4_ * auVar351._20_4_;
      auVar49._24_4_ = auVar351._24_4_ * auVar351._24_4_;
      auVar49._28_4_ = auVar351._28_4_;
      local_7e0 = vsubps_avx(auVar311,auVar49);
      auVar50._4_4_ = local_7e0._4_4_ * fVar119 * 4.0;
      auVar50._0_4_ = local_7e0._0_4_ * fVar116 * 4.0;
      auVar50._8_4_ = local_7e0._8_4_ * fVar122 * 4.0;
      auVar50._12_4_ = local_7e0._12_4_ * fVar125 * 4.0;
      auVar50._16_4_ = local_7e0._16_4_ * fVar327 * 4.0;
      auVar50._20_4_ = local_7e0._20_4_ * fVar329 * 4.0;
      auVar50._24_4_ = local_7e0._24_4_ * fVar331 * 4.0;
      auVar50._28_4_ = auVar351._28_4_;
      auVar97 = vsubps_avx(auVar33,auVar50);
      local_a40 = vcmpps_avx(auVar97,ZEXT832(0) << 0x20,5);
      auVar351 = local_a40;
      if ((((((((local_a40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_a40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_a40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_a40 >> 0x7f,0) == '\0') &&
            (local_a40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_a40 >> 0xbf,0) == '\0') &&
          (local_a40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_a40[0x1f]) {
        _local_7a0 = ZEXT832(0) << 0x20;
        _local_920 = ZEXT832(0) << 0x20;
        _local_b40 = local_920._0_28_;
        auVar219._8_4_ = 0x7f800000;
        auVar219._0_8_ = 0x7f8000007f800000;
        auVar219._12_4_ = 0x7f800000;
        auVar219._16_4_ = 0x7f800000;
        auVar219._20_4_ = 0x7f800000;
        auVar219._24_4_ = 0x7f800000;
        auVar219._28_4_ = 0x7f800000;
        auVar243._8_4_ = 0xff800000;
        auVar243._0_8_ = 0xff800000ff800000;
        auVar243._12_4_ = 0xff800000;
        auVar243._16_4_ = 0xff800000;
        auVar243._20_4_ = 0xff800000;
        auVar243._24_4_ = 0xff800000;
        auVar243._28_4_ = 0xff800000;
        local_a40 = auVar21;
        _local_860 = _local_920;
        local_7e0 = auVar15;
        _local_780 = _local_7a0;
        _local_5e0 = _local_920;
      }
      else {
        auVar365 = vsqrtps_avx(auVar97);
        auVar193._0_4_ = fVar116 + fVar116;
        auVar193._4_4_ = fVar119 + fVar119;
        auVar193._8_4_ = fVar122 + fVar122;
        auVar193._12_4_ = fVar125 + fVar125;
        auVar193._16_4_ = fVar327 + fVar327;
        auVar193._20_4_ = fVar329 + fVar329;
        auVar193._24_4_ = fVar331 + fVar331;
        auVar193._28_4_ = fVar229 + fVar229;
        auVar191 = vrcpps_avx(auVar193);
        fVar229 = auVar191._0_4_;
        fVar252 = auVar191._4_4_;
        auVar51._4_4_ = auVar193._4_4_ * fVar252;
        auVar51._0_4_ = auVar193._0_4_ * fVar229;
        fVar197 = auVar191._8_4_;
        auVar51._8_4_ = auVar193._8_4_ * fVar197;
        fVar255 = auVar191._12_4_;
        auVar51._12_4_ = auVar193._12_4_ * fVar255;
        fVar277 = auVar191._16_4_;
        auVar51._16_4_ = auVar193._16_4_ * fVar277;
        fVar280 = auVar191._20_4_;
        auVar51._20_4_ = auVar193._20_4_ * fVar280;
        fVar199 = auVar191._24_4_;
        auVar51._24_4_ = auVar193._24_4_ * fVar199;
        auVar51._28_4_ = auVar193._28_4_;
        auVar15 = vsubps_avx(auVar321,auVar51);
        fVar229 = fVar229 + fVar229 * auVar15._0_4_;
        fVar252 = fVar252 + fVar252 * auVar15._4_4_;
        fVar197 = fVar197 + fVar197 * auVar15._8_4_;
        fVar255 = fVar255 + fVar255 * auVar15._12_4_;
        fVar277 = fVar277 + fVar277 * auVar15._16_4_;
        fVar280 = fVar280 + fVar280 * auVar15._20_4_;
        fVar199 = fVar199 + fVar199 * auVar15._24_4_;
        fVar203 = auVar191._28_4_ + auVar15._28_4_;
        auVar244._0_8_ = local_360._0_8_ ^ 0x8000000080000000;
        auVar244._8_4_ = -local_360._8_4_;
        auVar244._12_4_ = -local_360._12_4_;
        auVar244._16_4_ = -local_360._16_4_;
        auVar244._20_4_ = -local_360._20_4_;
        auVar244._24_4_ = -local_360._24_4_;
        auVar244._28_4_ = -local_360._28_4_;
        auVar191 = vsubps_avx(auVar244,auVar365);
        fVar262 = auVar191._0_4_ * fVar229;
        fVar281 = auVar191._4_4_ * fVar252;
        auVar52._4_4_ = fVar281;
        auVar52._0_4_ = fVar262;
        fVar283 = auVar191._8_4_ * fVar197;
        auVar52._8_4_ = fVar283;
        fVar285 = auVar191._12_4_ * fVar255;
        auVar52._12_4_ = fVar285;
        fVar375 = auVar191._16_4_ * fVar277;
        auVar52._16_4_ = fVar375;
        fVar378 = auVar191._20_4_ * fVar280;
        auVar52._20_4_ = fVar378;
        fVar381 = auVar191._24_4_ * fVar199;
        auVar52._24_4_ = fVar381;
        auVar52._28_4_ = local_9c0._28_4_;
        auVar365 = vsubps_avx(auVar365,local_360);
        fVar229 = auVar365._0_4_ * fVar229;
        fVar252 = auVar365._4_4_ * fVar252;
        auVar53._4_4_ = fVar252;
        auVar53._0_4_ = fVar229;
        fVar197 = auVar365._8_4_ * fVar197;
        auVar53._8_4_ = fVar197;
        fVar255 = auVar365._12_4_ * fVar255;
        auVar53._12_4_ = fVar255;
        fVar277 = auVar365._16_4_ * fVar277;
        auVar53._16_4_ = fVar277;
        fVar280 = auVar365._20_4_ * fVar280;
        auVar53._20_4_ = fVar280;
        fVar199 = auVar365._24_4_ * fVar199;
        auVar53._24_4_ = fVar199;
        auVar53._28_4_ = fVar27;
        fVar205 = (fVar262 * fVar315 + fVar289) * local_3e0;
        fVar223 = (fVar281 * fVar323 + fVar303) * fStack_3dc;
        fVar227 = (fVar283 * fVar324 + fVar304) * fStack_3d8;
        fVar228 = (fVar285 * fVar325 + fVar305) * fStack_3d4;
        fVar230 = (fVar375 * fVar326 + fVar306) * fStack_3d0;
        fVar258 = (fVar378 * fVar328 + fVar307) * fStack_3cc;
        fVar260 = (fVar381 * fVar330 + fVar308) * fStack_3c8;
        auVar167._0_4_ = fVar79 + fVar205 * fVar196;
        auVar167._4_4_ = fVar108 + fVar223 * fVar275;
        auVar167._8_4_ = fVar111 + fVar227 * fVar202;
        auVar167._12_4_ = fVar114 + fVar228 * fVar226;
        auVar167._16_4_ = fVar117 + fVar230 * fVar256;
        auVar167._20_4_ = fVar120 + fVar258 * fVar278;
        auVar167._24_4_ = fVar123 + fVar260 * fVar12;
        auVar167._28_4_ = fVar126 + auVar365._28_4_ + fVar309;
        auVar54._4_4_ = fVar281 * fStack_6dc;
        auVar54._0_4_ = fVar262 * local_6e0;
        auVar54._8_4_ = fVar283 * fStack_6d8;
        auVar54._12_4_ = fVar285 * fStack_6d4;
        auVar54._16_4_ = fVar375 * fStack_6d0;
        auVar54._20_4_ = fVar378 * fStack_6cc;
        auVar54._24_4_ = fVar381 * fStack_6c8;
        auVar54._28_4_ = fVar203;
        auVar365 = vsubps_avx(auVar54,auVar167);
        _local_b40 = auVar365._0_28_;
        auVar194._0_4_ = auVar387._0_4_ + fVar174 * fVar205;
        auVar194._4_4_ = auVar387._4_4_ + fVar198 * fVar223;
        auVar194._8_4_ = auVar387._8_4_ + fVar200 * fVar227;
        auVar194._12_4_ = auVar387._12_4_ + fVar224 * fVar228;
        auVar194._16_4_ = auVar387._16_4_ + fVar250 * fVar230;
        auVar194._20_4_ = auVar387._20_4_ + fVar266 * fVar258;
        auVar194._24_4_ = auVar387._24_4_ + fVar287 * fVar260;
        auVar194._28_4_ = auVar387._28_4_ + fVar203;
        auVar55._4_4_ = fVar281 * fStack_6fc;
        auVar55._0_4_ = fVar262 * local_700;
        auVar55._8_4_ = fVar283 * fStack_6f8;
        auVar55._12_4_ = fVar285 * fStack_6f4;
        auVar55._16_4_ = fVar375 * fStack_6f0;
        auVar55._20_4_ = fVar378 * fStack_6ec;
        auVar55._24_4_ = fVar381 * fStack_6e8;
        auVar55._28_4_ = fVar113;
        _local_920 = vsubps_avx(auVar55,auVar194);
        auVar245._0_4_ = auVar384._0_4_ + fVar249 * fVar205;
        auVar245._4_4_ = auVar384._4_4_ + fVar265 * fVar223;
        auVar245._8_4_ = auVar384._8_4_ + fVar201 * fVar227;
        auVar245._12_4_ = auVar384._12_4_ + fVar225 * fVar228;
        auVar245._16_4_ = auVar384._16_4_ + fVar253 * fVar230;
        auVar245._20_4_ = auVar384._20_4_ + fVar276 * fVar258;
        auVar245._24_4_ = auVar384._24_4_ + fVar347 * fVar260;
        auVar245._28_4_ = auVar384._28_4_ + auVar191._28_4_;
        auVar56._4_4_ = fVar281 * fStack_71c;
        auVar56._0_4_ = fVar262 * local_720;
        auVar56._8_4_ = fVar283 * fStack_718;
        auVar56._12_4_ = fVar285 * fStack_714;
        auVar56._16_4_ = fVar375 * fStack_710;
        auVar56._20_4_ = fVar378 * fStack_70c;
        auVar56._24_4_ = fVar381 * fStack_708;
        auVar56._28_4_ = fVar113;
        _local_860 = vsubps_avx(auVar56,auVar245);
        fVar203 = (fVar229 * fVar315 + fVar289) * local_3e0;
        fVar205 = (fVar252 * fVar323 + fVar303) * fStack_3dc;
        fVar223 = (fVar197 * fVar324 + fVar304) * fStack_3d8;
        fVar227 = (fVar255 * fVar325 + fVar305) * fStack_3d4;
        fVar228 = (fVar277 * fVar326 + fVar306) * fStack_3d0;
        fVar230 = (fVar280 * fVar328 + fVar307) * fStack_3cc;
        fVar258 = (fVar199 * fVar330 + fVar308) * fStack_3c8;
        auVar272._0_4_ = fVar79 + fVar203 * fVar196;
        auVar272._4_4_ = fVar108 + fVar205 * fVar275;
        auVar272._8_4_ = fVar111 + fVar223 * fVar202;
        auVar272._12_4_ = fVar114 + fVar227 * fVar226;
        auVar272._16_4_ = fVar117 + fVar228 * fVar256;
        auVar272._20_4_ = fVar120 + fVar230 * fVar278;
        auVar272._24_4_ = fVar123 + fVar258 * fVar12;
        auVar272._28_4_ = fVar126 + fVar113;
        auVar57._4_4_ = fVar252 * fStack_6dc;
        auVar57._0_4_ = fVar229 * local_6e0;
        auVar57._8_4_ = fVar197 * fStack_6d8;
        auVar57._12_4_ = fVar255 * fStack_6d4;
        auVar57._16_4_ = fVar277 * fStack_6d0;
        auVar57._20_4_ = fVar280 * fStack_6cc;
        auVar57._24_4_ = fVar199 * fStack_6c8;
        auVar57._28_4_ = fStack_6c4;
        _local_780 = vsubps_avx(auVar57,auVar272);
        auVar273._0_4_ = auVar387._0_4_ + fVar174 * fVar203;
        auVar273._4_4_ = auVar387._4_4_ + fVar198 * fVar205;
        auVar273._8_4_ = auVar387._8_4_ + fVar200 * fVar223;
        auVar273._12_4_ = auVar387._12_4_ + fVar224 * fVar227;
        auVar273._16_4_ = auVar387._16_4_ + fVar250 * fVar228;
        auVar273._20_4_ = auVar387._20_4_ + fVar266 * fVar230;
        auVar273._24_4_ = auVar387._24_4_ + fVar287 * fVar258;
        auVar273._28_4_ = auVar387._28_4_ + local_780._28_4_;
        auVar58._4_4_ = fVar252 * fStack_6fc;
        auVar58._0_4_ = fVar229 * local_700;
        auVar58._8_4_ = fVar197 * fStack_6f8;
        auVar58._12_4_ = fVar255 * fStack_6f4;
        auVar58._16_4_ = fVar277 * fStack_6f0;
        auVar58._20_4_ = fVar280 * fStack_6ec;
        auVar58._24_4_ = fVar199 * fStack_6e8;
        auVar58._28_4_ = fStack_6c4;
        _local_7a0 = vsubps_avx(auVar58,auVar273);
        auVar246._0_4_ = auVar384._0_4_ + fVar249 * fVar203;
        auVar246._4_4_ = auVar384._4_4_ + fVar265 * fVar205;
        auVar246._8_4_ = auVar384._8_4_ + fVar201 * fVar223;
        auVar246._12_4_ = auVar384._12_4_ + fVar225 * fVar227;
        auVar246._16_4_ = auVar384._16_4_ + fVar253 * fVar228;
        auVar246._20_4_ = auVar384._20_4_ + fVar276 * fVar230;
        auVar246._24_4_ = auVar384._24_4_ + fVar347 * fVar258;
        auVar246._28_4_ = auVar384._28_4_ + local_860._28_4_ + fVar309;
        auVar59._4_4_ = fVar252 * fStack_71c;
        auVar59._0_4_ = fVar229 * local_720;
        auVar59._8_4_ = fVar197 * fStack_718;
        auVar59._12_4_ = fVar255 * fStack_714;
        auVar59._16_4_ = fVar277 * fStack_710;
        auVar59._20_4_ = fVar280 * fStack_70c;
        auVar59._24_4_ = fVar199 * fStack_708;
        auVar59._28_4_ = auVar273._28_4_;
        _local_5e0 = vsubps_avx(auVar59,auVar246);
        auVar138 = vcmpps_avx(auVar97,auVar138,5);
        auVar220._8_4_ = 0x7f800000;
        auVar220._0_8_ = 0x7f8000007f800000;
        auVar220._12_4_ = 0x7f800000;
        auVar220._16_4_ = 0x7f800000;
        auVar220._20_4_ = 0x7f800000;
        auVar220._24_4_ = 0x7f800000;
        auVar220._28_4_ = 0x7f800000;
        auVar219 = vblendvps_avx(auVar220,auVar52,auVar138);
        auVar300._8_4_ = 0x7fffffff;
        auVar300._0_8_ = 0x7fffffff7fffffff;
        auVar300._12_4_ = 0x7fffffff;
        auVar300._16_4_ = 0x7fffffff;
        auVar300._20_4_ = 0x7fffffff;
        auVar300._24_4_ = 0x7fffffff;
        auVar300._28_4_ = 0x7fffffff;
        auVar97 = vandps_avx(auVar300,local_340);
        auVar97 = vmaxps_avx(local_3c0,auVar97);
        auVar60._4_4_ = auVar97._4_4_ * 1.9073486e-06;
        auVar60._0_4_ = auVar97._0_4_ * 1.9073486e-06;
        auVar60._8_4_ = auVar97._8_4_ * 1.9073486e-06;
        auVar60._12_4_ = auVar97._12_4_ * 1.9073486e-06;
        auVar60._16_4_ = auVar97._16_4_ * 1.9073486e-06;
        auVar60._20_4_ = auVar97._20_4_ * 1.9073486e-06;
        auVar60._24_4_ = auVar97._24_4_ * 1.9073486e-06;
        auVar60._28_4_ = auVar97._28_4_;
        auVar97 = vandps_avx(auVar300,local_400);
        auVar97 = vcmpps_avx(auVar97,auVar60,1);
        auVar247._8_4_ = 0xff800000;
        auVar247._0_8_ = 0xff800000ff800000;
        auVar247._12_4_ = 0xff800000;
        auVar247._16_4_ = 0xff800000;
        auVar247._20_4_ = 0xff800000;
        auVar247._24_4_ = 0xff800000;
        auVar247._28_4_ = 0xff800000;
        auVar243 = vblendvps_avx(auVar247,auVar53,auVar138);
        auVar191 = auVar138 & auVar97;
        _local_880 = auVar96;
        if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar191 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar191 >> 0x7f,0) != '\0') ||
              (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar191 >> 0xbf,0) != '\0') ||
            (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar191[0x1f] < '\0') {
          auVar351 = vandps_avx(auVar97,auVar138);
          auVar188 = vpackssdw_avx(auVar351._0_16_,auVar351._16_16_);
          auVar365 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar191 = vcmpps_avx(local_7e0,auVar365,2);
          auVar386._8_4_ = 0xff800000;
          auVar386._0_8_ = 0xff800000ff800000;
          auVar386._12_4_ = 0xff800000;
          auVar386._16_4_ = 0xff800000;
          auVar386._20_4_ = 0xff800000;
          auVar386._24_4_ = 0xff800000;
          auVar386._28_4_ = 0xff800000;
          auVar388._8_4_ = 0x7f800000;
          auVar388._0_8_ = 0x7f8000007f800000;
          auVar388._12_4_ = 0x7f800000;
          auVar388._16_4_ = 0x7f800000;
          auVar388._20_4_ = 0x7f800000;
          auVar388._24_4_ = 0x7f800000;
          auVar388._28_4_ = 0x7f800000;
          auVar97 = vblendvps_avx(auVar388,auVar386,auVar191);
          auVar13 = vpmovsxwd_avx(auVar188);
          auVar188 = vpunpckhwd_avx(auVar188,auVar188);
          auVar301._16_16_ = auVar188;
          auVar301._0_16_ = auVar13;
          auVar219 = vblendvps_avx(auVar219,auVar97,auVar301);
          auVar97 = vblendvps_avx(auVar386,auVar388,auVar191);
          auVar243 = vblendvps_avx(auVar243,auVar97,auVar301);
          auVar97 = vcmpps_avx(auVar365,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar106._0_4_ = auVar351._0_4_ ^ auVar97._0_4_;
          auVar106._4_4_ = auVar351._4_4_ ^ auVar97._4_4_;
          auVar106._8_4_ = auVar351._8_4_ ^ auVar97._8_4_;
          auVar106._12_4_ = auVar351._12_4_ ^ auVar97._12_4_;
          auVar106._16_4_ = auVar351._16_4_ ^ auVar97._16_4_;
          auVar106._20_4_ = auVar351._20_4_ ^ auVar97._20_4_;
          auVar106._24_4_ = auVar351._24_4_ ^ auVar97._24_4_;
          auVar106._28_4_ = auVar351._28_4_ ^ auVar97._28_4_;
          auVar351 = vorps_avx(auVar191,auVar106);
          auVar351 = vandps_avx(auVar138,auVar351);
        }
      }
      auVar389 = ZEXT3264(local_8e0);
      auVar366 = ZEXT3264(local_9c0);
      auVar340 = ZEXT3264(local_a20);
      auVar336 = ZEXT3264(local_a00);
      auVar302 = ZEXT3264(local_9e0);
      fVar229 = (ray->dir).field_0.m128[0];
      auVar274 = ZEXT3264(CONCAT428(fVar229,CONCAT424(fVar229,CONCAT420(fVar229,CONCAT416(fVar229,
                                                  CONCAT412(fVar229,CONCAT48(fVar229,CONCAT44(
                                                  fVar229,fVar229))))))));
      local_600 = (ray->dir).field_0.m128[1];
      fStack_53c = (ray->dir).field_0.m128[2];
      local_440 = _local_5a0;
      local_420 = vminps_avx(local_460,auVar219);
      local_760 = vmaxps_avx(_local_5a0,auVar243);
      _local_480 = local_760;
      auVar97 = vcmpps_avx(_local_5a0,local_420,2);
      local_4e0 = vandps_avx(auVar96,auVar97);
      auVar97 = vcmpps_avx(local_760,local_460,2);
      local_520 = vandps_avx(auVar96,auVar97);
      auVar96 = vorps_avx(local_520,local_4e0);
      if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0x7f,0) == '\0') &&
            (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar96 >> 0xbf,0) == '\0') &&
          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar96[0x1f])
      goto LAB_00e44fa9;
      auVar96 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_560._0_4_ = auVar351._0_4_ ^ auVar96._0_4_;
      local_560._4_4_ = auVar351._4_4_ ^ auVar96._4_4_;
      local_560._8_4_ = auVar351._8_4_ ^ auVar96._8_4_;
      local_560._12_4_ = auVar351._12_4_ ^ auVar96._12_4_;
      local_560._16_4_ = auVar351._16_4_ ^ auVar96._16_4_;
      local_560._20_4_ = auVar351._20_4_ ^ auVar96._20_4_;
      local_560._24_4_ = auVar351._24_4_ ^ auVar96._24_4_;
      local_560._28_4_ = (uint)auVar351._28_4_ ^ (uint)auVar96._28_4_;
      auVar101._0_4_ =
           fVar229 * (float)local_b40._0_4_ +
           local_600 * (float)local_920._0_4_ + fStack_53c * (float)local_860._0_4_;
      auVar101._4_4_ =
           fVar229 * (float)local_b40._4_4_ +
           local_600 * (float)local_920._4_4_ + fStack_53c * (float)local_860._4_4_;
      auVar101._8_4_ = fVar229 * fStack_b38 + local_600 * fStack_918 + fStack_53c * fStack_858;
      auVar101._12_4_ = fVar229 * fStack_b34 + local_600 * fStack_914 + fStack_53c * fStack_854;
      auVar101._16_4_ = fVar229 * fStack_b30 + local_600 * fStack_910 + fStack_53c * fStack_850;
      auVar101._20_4_ = fVar229 * fStack_b2c + local_600 * fStack_90c + fStack_53c * fStack_84c;
      auVar101._24_4_ = fVar229 * fStack_b28 + local_600 * fStack_908 + fStack_53c * fStack_848;
      auVar101._28_4_ = auVar351._28_4_ + auVar96._28_4_ + local_760._28_4_;
      auVar141._8_4_ = 0x7fffffff;
      auVar141._0_8_ = 0x7fffffff7fffffff;
      auVar141._12_4_ = 0x7fffffff;
      auVar141._16_4_ = 0x7fffffff;
      auVar141._20_4_ = 0x7fffffff;
      auVar141._24_4_ = 0x7fffffff;
      auVar141._28_4_ = 0x7fffffff;
      auVar96 = vandps_avx(auVar101,auVar141);
      auVar142._8_4_ = 0x3e99999a;
      auVar142._0_8_ = 0x3e99999a3e99999a;
      auVar142._12_4_ = 0x3e99999a;
      auVar142._16_4_ = 0x3e99999a;
      auVar142._20_4_ = 0x3e99999a;
      auVar142._24_4_ = 0x3e99999a;
      auVar142._28_4_ = 0x3e99999a;
      auVar96 = vcmpps_avx(auVar96,auVar142,1);
      auVar96 = vorps_avx(auVar96,local_560);
      auVar143._8_4_ = 3;
      auVar143._0_8_ = 0x300000003;
      auVar143._12_4_ = 3;
      auVar143._16_4_ = 3;
      auVar143._20_4_ = 3;
      auVar143._24_4_ = 3;
      auVar143._28_4_ = 3;
      auVar168._8_4_ = 2;
      auVar168._0_8_ = 0x200000002;
      auVar168._12_4_ = 2;
      auVar168._16_4_ = 2;
      auVar168._20_4_ = 2;
      auVar168._24_4_ = 2;
      auVar168._28_4_ = 2;
      auVar96 = vblendvps_avx(auVar168,auVar143,auVar96);
      local_580 = ZEXT432(local_b44);
      auVar13 = vpshufd_avx(ZEXT416(local_b44),0);
      auVar188 = vpcmpgtd_avx(auVar96._16_16_,auVar13);
      local_5c0 = auVar13._0_4_;
      fStack_5bc = auVar13._4_4_;
      fStack_5b8 = auVar13._8_4_;
      fStack_5b4 = auVar13._12_4_;
      auVar13 = vpcmpgtd_avx(auVar96._0_16_,auVar13);
      auVar144._16_16_ = auVar188;
      auVar144._0_16_ = auVar13;
      local_500 = vblendps_avx(ZEXT1632(auVar13),auVar144,0xf0);
      auVar96 = vandnps_avx(local_500,local_4e0);
      auVar351 = local_4e0 & ~local_500;
      local_540 = fStack_53c;
      fStack_538 = fStack_53c;
      fStack_534 = fStack_53c;
      fStack_530 = fStack_53c;
      fStack_52c = fStack_53c;
      fStack_528 = fStack_53c;
      fStack_524 = fStack_53c;
      fStack_5fc = local_600;
      fStack_5f8 = local_600;
      fStack_5f4 = local_600;
      fStack_5f0 = local_600;
      fStack_5ec = local_600;
      fStack_5e8 = local_600;
      fStack_5e4 = local_600;
      if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar351 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar351 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar351 >> 0x7f,0) == '\0') &&
            (auVar351 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar351 >> 0xbf,0) == '\0') &&
          (auVar351 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar351[0x1f]) {
        fVar174 = ray->tfar;
        auVar102._4_4_ = fVar174;
        auVar102._0_4_ = fVar174;
        auVar102._8_4_ = fVar174;
        auVar102._12_4_ = fVar174;
        auVar102._16_4_ = fVar174;
        auVar102._20_4_ = fVar174;
        auVar102._24_4_ = fVar174;
        auVar102._28_4_ = fVar174;
        auVar322 = ZEXT3264(local_900);
        local_4c0 = auVar96;
      }
      else {
        local_740._4_4_ = (float)local_5a0._4_4_ + (float)local_640._4_4_;
        local_740._0_4_ = (float)local_5a0._0_4_ + (float)local_640._0_4_;
        fStack_738 = fStack_598 + fStack_638;
        fStack_734 = fStack_594 + fStack_634;
        fStack_730 = fStack_590 + fStack_630;
        fStack_72c = fStack_58c + fStack_62c;
        fStack_728 = fStack_588 + fStack_628;
        fStack_724 = fStack_584 + fStack_624;
        do {
          auVar103._8_4_ = 0x7f800000;
          auVar103._0_8_ = 0x7f8000007f800000;
          auVar103._12_4_ = 0x7f800000;
          auVar103._16_4_ = 0x7f800000;
          auVar103._20_4_ = 0x7f800000;
          auVar103._24_4_ = 0x7f800000;
          auVar103._28_4_ = 0x7f800000;
          auVar351 = vblendvps_avx(auVar103,_local_5a0,auVar96);
          auVar97 = vshufps_avx(auVar351,auVar351,0xb1);
          auVar97 = vminps_avx(auVar351,auVar97);
          auVar138 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar138);
          auVar138 = vperm2f128_avx(auVar97,auVar97,1);
          auVar97 = vminps_avx(auVar97,auVar138);
          auVar97 = vcmpps_avx(auVar351,auVar97,0);
          auVar138 = auVar96 & auVar97;
          auVar351 = auVar96;
          if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar138 >> 0x7f,0) != '\0') ||
                (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar138 >> 0xbf,0) != '\0') ||
              (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar138[0x1f] < '\0') {
            auVar351 = vandps_avx(auVar97,auVar96);
          }
          uVar69 = vmovmskps_avx(auVar351);
          uVar72 = 0;
          if (uVar69 != 0) {
            for (; (uVar69 >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
            }
          }
          uVar71 = (ulong)uVar72;
          local_4c0 = auVar96;
          *(undefined4 *)(local_4c0 + uVar71 * 4) = 0;
          aVar7 = (ray->dir).field_0;
          _local_920 = (undefined1  [16])aVar7;
          auVar188 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
          fVar174 = local_1a0[uVar71];
          uVar72 = *(uint *)(local_440 + uVar71 * 4);
          if (auVar188._0_4_ < 0.0) {
            fVar249 = sqrtf(auVar188._0_4_);
          }
          else {
            auVar188 = vsqrtss_avx(auVar188,auVar188);
            fVar249 = auVar188._0_4_;
          }
          auVar13 = vminps_avx(_local_960,_local_980);
          auVar188 = vmaxps_avx(_local_960,_local_980);
          auVar14 = vminps_avx(_local_970,_local_990);
          auVar92 = vminps_avx(auVar13,auVar14);
          auVar13 = vmaxps_avx(_local_970,_local_990);
          auVar14 = vmaxps_avx(auVar188,auVar13);
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar188 = vandps_avx(auVar92,auVar177);
          auVar13 = vandps_avx(auVar14,auVar177);
          auVar188 = vmaxps_avx(auVar188,auVar13);
          auVar13 = vmovshdup_avx(auVar188);
          auVar13 = vmaxss_avx(auVar13,auVar188);
          auVar188 = vshufpd_avx(auVar188,auVar188,1);
          auVar188 = vmaxss_avx(auVar188,auVar13);
          local_860._0_4_ = auVar188._0_4_ * 1.9073486e-06;
          local_820._0_4_ = fVar249 * 1.9073486e-06;
          local_6c0._0_16_ = vshufps_avx(auVar14,auVar14,0xff);
          auVar188 = vinsertps_avx(ZEXT416(uVar72),ZEXT416((uint)fVar174),0x10);
          bVar77 = true;
          uVar71 = 0;
          do {
            auVar13 = vmovshdup_avx(auVar188);
            fVar200 = auVar13._0_4_;
            local_a40._0_4_ = 1.0 - fVar200;
            auVar13 = vshufps_avx(auVar188,auVar188,0x55);
            fVar174 = auVar13._0_4_;
            fVar249 = auVar13._4_4_;
            fVar196 = auVar13._8_4_;
            fVar252 = auVar13._12_4_;
            auVar13 = vshufps_avx(ZEXT416((uint)local_a40._0_4_),ZEXT416((uint)local_a40._0_4_),0);
            fVar197 = auVar13._0_4_;
            fVar255 = auVar13._4_4_;
            fVar198 = auVar13._8_4_;
            fVar265 = auVar13._12_4_;
            fVar275 = (float)local_970._0_4_ * fVar174 + (float)local_980._0_4_ * fVar197;
            fVar277 = (float)local_970._4_4_ * fVar249 + (float)local_980._4_4_ * fVar255;
            fVar280 = fStack_968 * fVar196 + fStack_978 * fVar198;
            fVar199 = fStack_964 * fVar252 + fStack_974 * fVar265;
            auVar234._0_4_ =
                 fVar197 * ((float)local_980._0_4_ * fVar174 + fVar197 * (float)local_960._0_4_) +
                 fVar174 * fVar275;
            auVar234._4_4_ =
                 fVar255 * ((float)local_980._4_4_ * fVar249 + fVar255 * (float)local_960._4_4_) +
                 fVar249 * fVar277;
            auVar234._8_4_ =
                 fVar198 * (fStack_978 * fVar196 + fVar198 * fStack_958) + fVar196 * fVar280;
            auVar234._12_4_ =
                 fVar265 * (fStack_974 * fVar252 + fVar265 * fStack_954) + fVar252 * fVar199;
            auVar178._0_4_ =
                 fVar197 * fVar275 +
                 fVar174 * (fVar174 * (float)local_990._0_4_ + (float)local_970._0_4_ * fVar197);
            auVar178._4_4_ =
                 fVar255 * fVar277 +
                 fVar249 * (fVar249 * (float)local_990._4_4_ + (float)local_970._4_4_ * fVar255);
            auVar178._8_4_ =
                 fVar198 * fVar280 + fVar196 * (fVar196 * fStack_988 + fStack_968 * fVar198);
            auVar178._12_4_ =
                 fVar265 * fVar199 + fVar252 * (fVar252 * fStack_984 + fStack_964 * fVar265);
            auVar13 = vshufps_avx(auVar188,auVar188,0);
            auVar131._0_4_ = auVar13._0_4_ * (float)local_920._0_4_ + 0.0;
            auVar131._4_4_ = auVar13._4_4_ * (float)local_920._4_4_ + 0.0;
            auVar131._8_4_ = auVar13._8_4_ * fStack_918 + 0.0;
            auVar131._12_4_ = auVar13._12_4_ * fStack_914 + 0.0;
            auVar87._0_4_ = fVar197 * auVar234._0_4_ + fVar174 * auVar178._0_4_;
            auVar87._4_4_ = fVar255 * auVar234._4_4_ + fVar249 * auVar178._4_4_;
            auVar87._8_4_ = fVar198 * auVar234._8_4_ + fVar196 * auVar178._8_4_;
            auVar87._12_4_ = fVar265 * auVar234._12_4_ + fVar252 * auVar178._12_4_;
            local_7e0._0_16_ = auVar87;
            auVar13 = vsubps_avx(auVar131,auVar87);
            _local_880 = auVar13;
            auVar13 = vdpps_avx(auVar13,auVar13,0x7f);
            fVar174 = auVar13._0_4_;
            if (fVar174 < 0.0) {
              local_a40._0_16_ = ZEXT416((uint)local_a40._0_4_);
              local_a60._0_16_ = auVar234;
              local_a80._0_16_ = auVar178;
              fVar249 = sqrtf(fVar174);
              auVar178 = local_a80._0_16_;
              auVar234 = local_a60._0_16_;
            }
            else {
              auVar14 = vsqrtss_avx(auVar13,auVar13);
              fVar249 = auVar14._0_4_;
            }
            auVar14 = vsubps_avx(auVar178,auVar234);
            auVar293._0_4_ = auVar14._0_4_ * 3.0;
            auVar293._4_4_ = auVar14._4_4_ * 3.0;
            auVar293._8_4_ = auVar14._8_4_ * 3.0;
            auVar293._12_4_ = auVar14._12_4_ * 3.0;
            auVar14 = vshufps_avx(ZEXT416((uint)(fVar200 * 6.0)),ZEXT416((uint)(fVar200 * 6.0)),0);
            auVar92 = ZEXT416((uint)(((float)local_a40._0_4_ - (fVar200 + fVar200)) * 6.0));
            auVar162 = vshufps_avx(auVar92,auVar92,0);
            auVar92 = ZEXT416((uint)((fVar200 - ((float)local_a40._0_4_ + (float)local_a40._0_4_)) *
                                    6.0));
            auVar185 = vshufps_avx(auVar92,auVar92,0);
            auVar82 = vshufps_avx(ZEXT416((uint)((float)local_a40._0_4_ * 6.0)),
                                  ZEXT416((uint)((float)local_a40._0_4_ * 6.0)),0);
            auVar92 = vdpps_avx(auVar293,auVar293,0x7f);
            auVar132._0_4_ =
                 auVar82._0_4_ * (float)local_960._0_4_ +
                 auVar185._0_4_ * (float)local_980._0_4_ +
                 auVar14._0_4_ * (float)local_990._0_4_ + auVar162._0_4_ * (float)local_970._0_4_;
            auVar132._4_4_ =
                 auVar82._4_4_ * (float)local_960._4_4_ +
                 auVar185._4_4_ * (float)local_980._4_4_ +
                 auVar14._4_4_ * (float)local_990._4_4_ + auVar162._4_4_ * (float)local_970._4_4_;
            auVar132._8_4_ =
                 auVar82._8_4_ * fStack_958 +
                 auVar185._8_4_ * fStack_978 +
                 auVar14._8_4_ * fStack_988 + auVar162._8_4_ * fStack_968;
            auVar132._12_4_ =
                 auVar82._12_4_ * fStack_954 +
                 auVar185._12_4_ * fStack_974 +
                 auVar14._12_4_ * fStack_984 + auVar162._12_4_ * fStack_964;
            auVar14 = vblendps_avx(auVar92,_DAT_01f7aa10,0xe);
            auVar162 = vrsqrtss_avx(auVar14,auVar14);
            fVar252 = auVar162._0_4_;
            fVar196 = auVar92._0_4_;
            auVar162 = vdpps_avx(auVar293,auVar132,0x7f);
            auVar185 = vshufps_avx(auVar92,auVar92,0);
            auVar133._0_4_ = auVar132._0_4_ * auVar185._0_4_;
            auVar133._4_4_ = auVar132._4_4_ * auVar185._4_4_;
            auVar133._8_4_ = auVar132._8_4_ * auVar185._8_4_;
            auVar133._12_4_ = auVar132._12_4_ * auVar185._12_4_;
            auVar162 = vshufps_avx(auVar162,auVar162,0);
            auVar209._0_4_ = auVar293._0_4_ * auVar162._0_4_;
            auVar209._4_4_ = auVar293._4_4_ * auVar162._4_4_;
            auVar209._8_4_ = auVar293._8_4_ * auVar162._8_4_;
            auVar209._12_4_ = auVar293._12_4_ * auVar162._12_4_;
            auVar82 = vsubps_avx(auVar133,auVar209);
            auVar162 = vrcpss_avx(auVar14,auVar14);
            auVar14 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                 ZEXT416((uint)(auVar188._0_4_ * (float)local_820._0_4_)));
            auVar162 = ZEXT416((uint)(auVar162._0_4_ * (2.0 - fVar196 * auVar162._0_4_)));
            auVar162 = vshufps_avx(auVar162,auVar162,0);
            uVar61 = CONCAT44(auVar293._4_4_,auVar293._0_4_);
            auVar317._0_8_ = uVar61 ^ 0x8000000080000000;
            auVar317._8_4_ = -auVar293._8_4_;
            auVar317._12_4_ = -auVar293._12_4_;
            auVar185 = ZEXT416((uint)(fVar252 * 1.5 + fVar196 * -0.5 * fVar252 * fVar252 * fVar252))
            ;
            auVar185 = vshufps_avx(auVar185,auVar185,0);
            auVar179._0_4_ = auVar185._0_4_ * auVar82._0_4_ * auVar162._0_4_;
            auVar179._4_4_ = auVar185._4_4_ * auVar82._4_4_ * auVar162._4_4_;
            auVar179._8_4_ = auVar185._8_4_ * auVar82._8_4_ * auVar162._8_4_;
            auVar179._12_4_ = auVar185._12_4_ * auVar82._12_4_ * auVar162._12_4_;
            local_800._0_4_ = auVar293._0_4_ * auVar185._0_4_;
            local_800._4_4_ = auVar293._4_4_ * auVar185._4_4_;
            local_800._8_4_ = auVar293._8_4_ * auVar185._8_4_;
            local_800._12_4_ = auVar293._12_4_ * auVar185._12_4_;
            local_a40._0_16_ = auVar293;
            if (fVar196 < 0.0) {
              local_a60._0_4_ = fVar249;
              local_a80._0_16_ = auVar317;
              local_840._0_16_ = auVar179;
              fVar196 = sqrtf(fVar196);
              auVar179 = local_840._0_16_;
              auVar317 = local_a80._0_16_;
            }
            else {
              auVar92 = vsqrtss_avx(auVar92,auVar92);
              fVar196 = auVar92._0_4_;
              local_a60._0_4_ = fVar249;
            }
            auVar92 = vdpps_avx(_local_880,local_800._0_16_,0x7f);
            local_a80._0_4_ =
                 ((float)local_860._0_4_ / fVar196) * ((float)local_a60._0_4_ + 1.0) +
                 (float)local_a60._0_4_ * (float)local_860._0_4_ + auVar14._0_4_;
            auVar162 = vdpps_avx(auVar317,local_800._0_16_,0x7f);
            auVar185 = vdpps_avx(_local_880,auVar179,0x7f);
            auVar82 = vdpps_avx(_local_920,local_800._0_16_,0x7f);
            auVar83 = vdpps_avx(_local_880,auVar317,0x7f);
            fVar249 = auVar162._0_4_ + auVar185._0_4_;
            fVar196 = auVar92._0_4_;
            auVar88._0_4_ = fVar196 * fVar196;
            auVar88._4_4_ = auVar92._4_4_ * auVar92._4_4_;
            auVar88._8_4_ = auVar92._8_4_ * auVar92._8_4_;
            auVar88._12_4_ = auVar92._12_4_ * auVar92._12_4_;
            auVar185 = vsubps_avx(auVar13,auVar88);
            local_800._0_16_ = ZEXT416((uint)fVar249);
            auVar162 = vdpps_avx(_local_880,_local_920,0x7f);
            fVar252 = auVar83._0_4_ - fVar196 * fVar249;
            local_a60._0_16_ = auVar92;
            fVar196 = auVar162._0_4_ - fVar196 * auVar82._0_4_;
            auVar92 = vrsqrtss_avx(auVar185,auVar185);
            fVar197 = auVar185._0_4_;
            fVar249 = auVar92._0_4_;
            fVar249 = fVar249 * 1.5 + fVar197 * -0.5 * fVar249 * fVar249 * fVar249;
            if (fVar197 < 0.0) {
              local_840._0_16_ = auVar82;
              local_660._0_4_ = fVar252;
              local_680._0_4_ = fVar196;
              local_6a0._0_4_ = fVar249;
              fVar197 = sqrtf(fVar197);
              fVar249 = (float)local_6a0._0_4_;
              fVar252 = (float)local_660._0_4_;
              fVar196 = (float)local_680._0_4_;
              auVar82 = local_840._0_16_;
            }
            else {
              auVar92 = vsqrtss_avx(auVar185,auVar185);
              fVar197 = auVar92._0_4_;
            }
            auVar302 = ZEXT3264(local_9e0);
            auVar336 = ZEXT3264(local_a00);
            auVar340 = ZEXT3264(local_a20);
            auVar389 = ZEXT3264(local_8e0);
            auVar366 = ZEXT3264(local_9c0);
            auVar322 = ZEXT3264(local_900);
            auVar137 = vpermilps_avx(local_7e0._0_16_,0xff);
            auVar83 = vshufps_avx(local_a40._0_16_,local_a40._0_16_,0xff);
            fVar252 = fVar252 * fVar249 - auVar83._0_4_;
            auVar210._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
            auVar210._8_4_ = auVar82._8_4_ ^ 0x80000000;
            auVar210._12_4_ = auVar82._12_4_ ^ 0x80000000;
            auVar235._0_4_ = -fVar252;
            auVar235._4_4_ = 0x80000000;
            auVar235._8_4_ = 0x80000000;
            auVar235._12_4_ = 0x80000000;
            auVar92 = vinsertps_avx(auVar235,ZEXT416((uint)(fVar196 * fVar249)),0x1c);
            auVar185 = vmovsldup_avx(ZEXT416((uint)(local_800._0_4_ * fVar196 * fVar249 -
                                                   auVar82._0_4_ * fVar252)));
            auVar92 = vdivps_avx(auVar92,auVar185);
            auVar162 = vinsertps_avx(local_800._0_16_,auVar210,0x10);
            auVar162 = vdivps_avx(auVar162,auVar185);
            auVar185 = vmovsldup_avx(local_a60._0_16_);
            auVar137 = ZEXT416((uint)(fVar197 - auVar137._0_4_));
            auVar82 = vmovsldup_avx(auVar137);
            auVar160._0_4_ = auVar185._0_4_ * auVar92._0_4_ + auVar82._0_4_ * auVar162._0_4_;
            auVar160._4_4_ = auVar185._4_4_ * auVar92._4_4_ + auVar82._4_4_ * auVar162._4_4_;
            auVar160._8_4_ = auVar185._8_4_ * auVar92._8_4_ + auVar82._8_4_ * auVar162._8_4_;
            auVar160._12_4_ = auVar185._12_4_ * auVar92._12_4_ + auVar82._12_4_ * auVar162._12_4_;
            auVar188 = vsubps_avx(auVar188,auVar160);
            auVar161._8_4_ = 0x7fffffff;
            auVar161._0_8_ = 0x7fffffff7fffffff;
            auVar161._12_4_ = 0x7fffffff;
            auVar92 = vandps_avx(local_a60._0_16_,auVar161);
            if (auVar92._0_4_ < (float)local_a80._0_4_) {
              auVar180._8_4_ = 0x7fffffff;
              auVar180._0_8_ = 0x7fffffff7fffffff;
              auVar180._12_4_ = 0x7fffffff;
              auVar92 = vandps_avx(auVar137,auVar180);
              if (auVar92._0_4_ <
                  (float)local_6c0._0_4_ * 1.9073486e-06 + (float)local_a80._0_4_ + auVar14._0_4_) {
                fVar249 = auVar188._0_4_ + (float)local_7c0._0_4_;
                bVar67 = 0;
                if (((ray->org).field_0.m128[3] <= fVar249) &&
                   (fVar196 = ray->tfar, bVar67 = 0, fVar249 <= fVar196)) {
                  auVar188 = vmovshdup_avx(auVar188);
                  bVar67 = 0;
                  fVar252 = auVar188._0_4_;
                  if ((0.0 <= fVar252) && (fVar252 <= 1.0)) {
                    auVar188 = vrsqrtss_avx(auVar13,auVar13);
                    fVar197 = auVar188._0_4_;
                    pGVar9 = (context->scene->geometries).items[uVar68].ptr;
                    if ((pGVar9->mask & ray->mask) == 0) {
                      bVar67 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar67 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar188 = ZEXT416((uint)(fVar197 * 1.5 +
                                               fVar174 * -0.5 * fVar197 * fVar197 * fVar197));
                      auVar188 = vshufps_avx(auVar188,auVar188,0);
                      auVar181._0_4_ = auVar188._0_4_ * (float)local_880._0_4_;
                      auVar181._4_4_ = auVar188._4_4_ * (float)local_880._4_4_;
                      auVar181._8_4_ = auVar188._8_4_ * fStack_878;
                      auVar181._12_4_ = auVar188._12_4_ * fStack_874;
                      auVar89._0_4_ = local_a40._0_4_ + auVar83._0_4_ * auVar181._0_4_;
                      auVar89._4_4_ = local_a40._4_4_ + auVar83._4_4_ * auVar181._4_4_;
                      auVar89._8_4_ = local_a40._8_4_ + auVar83._8_4_ * auVar181._8_4_;
                      auVar89._12_4_ = local_a40._12_4_ + auVar83._12_4_ * auVar181._12_4_;
                      auVar188 = vshufps_avx(auVar181,auVar181,0xc9);
                      auVar13 = vshufps_avx(local_a40._0_16_,local_a40._0_16_,0xc9);
                      auVar182._0_4_ = auVar13._0_4_ * auVar181._0_4_;
                      auVar182._4_4_ = auVar13._4_4_ * auVar181._4_4_;
                      auVar182._8_4_ = auVar13._8_4_ * auVar181._8_4_;
                      auVar182._12_4_ = auVar13._12_4_ * auVar181._12_4_;
                      auVar211._0_4_ = local_a40._0_4_ * auVar188._0_4_;
                      auVar211._4_4_ = local_a40._4_4_ * auVar188._4_4_;
                      auVar211._8_4_ = local_a40._8_4_ * auVar188._8_4_;
                      auVar211._12_4_ = local_a40._12_4_ * auVar188._12_4_;
                      auVar14 = vsubps_avx(auVar211,auVar182);
                      auVar188 = vshufps_avx(auVar14,auVar14,0xc9);
                      auVar13 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar212._0_4_ = auVar13._0_4_ * auVar188._0_4_;
                      auVar212._4_4_ = auVar13._4_4_ * auVar188._4_4_;
                      auVar212._8_4_ = auVar13._8_4_ * auVar188._8_4_;
                      auVar212._12_4_ = auVar13._12_4_ * auVar188._12_4_;
                      auVar188 = vshufps_avx(auVar14,auVar14,0xd2);
                      auVar90._0_4_ = auVar89._0_4_ * auVar188._0_4_;
                      auVar90._4_4_ = auVar89._4_4_ * auVar188._4_4_;
                      auVar90._8_4_ = auVar89._8_4_ * auVar188._8_4_;
                      auVar90._12_4_ = auVar89._12_4_ * auVar188._12_4_;
                      auVar13 = vsubps_avx(auVar212,auVar90);
                      auVar188 = vshufps_avx(auVar13,auVar13,0xe9);
                      local_8c0 = vmovlps_avx(auVar188);
                      local_8b8 = auVar13._0_4_;
                      local_8b0 = 0;
                      local_8ac = (undefined4)local_888;
                      local_8a4 = context->user->instID[0];
                      local_8a0 = context->user->instPrimID[0];
                      ray->tfar = fVar249;
                      local_620._0_4_ = 0xffffffff;
                      local_950.valid = (int *)local_620;
                      local_950.geometryUserPtr = pGVar9->userPtr;
                      local_950.context = context->user;
                      local_950.hit = (RTCHitN *)&local_8c0;
                      local_950.N = 1;
                      local_950.ray = (RTCRayN *)ray;
                      local_8b4 = fVar252;
                      local_8a8 = uVar68;
                      if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar9->occlusionFilterN)(&local_950), *local_950.valid != 0)) {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                              RTC_RAY_QUERY_FLAG_INCOHERENT ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) &&
                            ((*p_Var10)(&local_950), *local_950.valid == 0)))) goto LAB_00e45ede;
                        bVar67 = 1;
                      }
                      else {
LAB_00e45ede:
                        ray->tfar = fVar196;
                        bVar67 = 0;
                      }
                      auVar302 = ZEXT3264(local_9e0);
                      auVar336 = ZEXT3264(local_a00);
                      auVar340 = ZEXT3264(local_a20);
                      auVar389 = ZEXT3264(local_8e0);
                      auVar366 = ZEXT3264(local_9c0);
                      auVar322 = ZEXT3264(local_900);
                    }
                  }
                }
                goto LAB_00e45c75;
              }
            }
            bVar77 = uVar71 < 4;
            uVar71 = uVar71 + 1;
          } while (uVar71 != 5);
          bVar77 = false;
          bVar67 = 5;
LAB_00e45c75:
          bVar74 = (bool)(bVar74 | bVar77 & bVar67);
          fVar174 = ray->tfar;
          auVar102._4_4_ = fVar174;
          auVar102._0_4_ = fVar174;
          auVar102._8_4_ = fVar174;
          auVar102._12_4_ = fVar174;
          auVar102._16_4_ = fVar174;
          auVar102._20_4_ = fVar174;
          auVar102._24_4_ = fVar174;
          auVar102._28_4_ = fVar174;
          auVar351 = vcmpps_avx(_local_740,auVar102,2);
          auVar96 = vandps_avx(auVar351,local_4c0);
          local_4c0 = local_4c0 & auVar351;
        } while ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_4c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_4c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_4c0 >> 0x7f,0) != '\0') ||
                   (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_4c0 >> 0xbf,0) != '\0') ||
                 (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_4c0[0x1f] < '\0');
        local_4c0 = auVar96;
      }
      auVar97 = _local_480;
      auVar145._0_4_ =
           fVar229 * (float)local_780._0_4_ +
           local_600 * (float)local_7a0._0_4_ + local_540 * (float)local_5e0._0_4_;
      auVar145._4_4_ =
           fVar229 * (float)local_780._4_4_ +
           fStack_5fc * (float)local_7a0._4_4_ + fStack_53c * (float)local_5e0._4_4_;
      auVar145._8_4_ = fVar229 * fStack_778 + fStack_5f8 * fStack_798 + fStack_538 * fStack_5d8;
      auVar145._12_4_ = fVar229 * fStack_774 + fStack_5f4 * fStack_794 + fStack_534 * fStack_5d4;
      auVar145._16_4_ = fVar229 * fStack_770 + fStack_5f0 * fStack_790 + fStack_530 * fStack_5d0;
      auVar145._20_4_ = fVar229 * fStack_76c + fStack_5ec * fStack_78c + fStack_52c * fStack_5cc;
      auVar145._24_4_ = fVar229 * fStack_768 + fStack_5e8 * fStack_788 + fStack_528 * fStack_5c8;
      auVar145._28_4_ = fStack_5e4 + fStack_5e4 + fStack_524;
      auVar169._8_4_ = 0x7fffffff;
      auVar169._0_8_ = 0x7fffffff7fffffff;
      auVar169._12_4_ = 0x7fffffff;
      auVar169._16_4_ = 0x7fffffff;
      auVar169._20_4_ = 0x7fffffff;
      auVar169._24_4_ = 0x7fffffff;
      auVar169._28_4_ = 0x7fffffff;
      auVar96 = vandps_avx(auVar145,auVar169);
      auVar170._8_4_ = 0x3e99999a;
      auVar170._0_8_ = 0x3e99999a3e99999a;
      auVar170._12_4_ = 0x3e99999a;
      auVar170._16_4_ = 0x3e99999a;
      auVar170._20_4_ = 0x3e99999a;
      auVar170._24_4_ = 0x3e99999a;
      auVar170._28_4_ = 0x3e99999a;
      auVar96 = vcmpps_avx(auVar96,auVar170,1);
      auVar351 = vorps_avx(auVar96,local_560);
      auVar171._0_4_ = (float)local_640._0_4_ + local_760._0_4_;
      auVar171._4_4_ = (float)local_640._4_4_ + local_760._4_4_;
      auVar171._8_4_ = fStack_638 + local_760._8_4_;
      auVar171._12_4_ = fStack_634 + local_760._12_4_;
      auVar171._16_4_ = fStack_630 + local_760._16_4_;
      auVar171._20_4_ = fStack_62c + local_760._20_4_;
      auVar171._24_4_ = fStack_628 + local_760._24_4_;
      auVar171._28_4_ = fStack_624 + local_760._28_4_;
      auVar96 = vcmpps_avx(auVar171,auVar102,2);
      _local_7a0 = vandps_avx(auVar96,local_520);
      auVar172._8_4_ = 3;
      auVar172._0_8_ = 0x300000003;
      auVar172._12_4_ = 3;
      auVar172._16_4_ = 3;
      auVar172._20_4_ = 3;
      auVar172._24_4_ = 3;
      auVar172._28_4_ = 3;
      auVar195._8_4_ = 2;
      auVar195._0_8_ = 0x200000002;
      auVar195._12_4_ = 2;
      auVar195._16_4_ = 2;
      auVar195._20_4_ = 2;
      auVar195._24_4_ = 2;
      auVar195._28_4_ = 2;
      auVar96 = vblendvps_avx(auVar195,auVar172,auVar351);
      auVar64._4_4_ = fStack_5bc;
      auVar64._0_4_ = local_5c0;
      auVar64._8_4_ = fStack_5b8;
      auVar64._12_4_ = fStack_5b4;
      auVar188 = vpcmpgtd_avx(auVar96._16_16_,auVar64);
      auVar13 = vpshufd_avx(local_580._0_16_,0);
      auVar13 = vpcmpgtd_avx(auVar96._0_16_,auVar13);
      auVar173._16_16_ = auVar188;
      auVar173._0_16_ = auVar102._0_16_;
      _local_780 = vblendps_avx(ZEXT1632(auVar13),auVar173,0xf0);
      auVar96 = vandnps_avx(_local_780,_local_7a0);
      auVar351 = _local_7a0 & ~_local_780;
      local_620 = auVar96;
      if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar351 >> 0x7f,0) != '\0') ||
            (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar351 >> 0xbf,0) != '\0') ||
          (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar351[0x1f] < '\0') {
        local_740._4_4_ = (float)local_640._4_4_ + local_480._4_4_;
        local_740._0_4_ = (float)local_640._0_4_ + local_480._0_4_;
        fStack_738 = fStack_638 + local_480._8_4_;
        fStack_734 = fStack_634 + local_480._12_4_;
        fStack_730 = fStack_630 + local_480._16_4_;
        fStack_72c = fStack_62c + local_480._20_4_;
        fStack_728 = fStack_628 + local_480._24_4_;
        fStack_724 = fStack_624 + local_480._28_4_;
        do {
          auVar104._8_4_ = 0x7f800000;
          auVar104._0_8_ = 0x7f8000007f800000;
          auVar104._12_4_ = 0x7f800000;
          auVar104._16_4_ = 0x7f800000;
          auVar104._20_4_ = 0x7f800000;
          auVar104._24_4_ = 0x7f800000;
          auVar104._28_4_ = 0x7f800000;
          auVar351 = vblendvps_avx(auVar104,auVar97,auVar96);
          auVar138 = vshufps_avx(auVar351,auVar351,0xb1);
          auVar138 = vminps_avx(auVar351,auVar138);
          auVar191 = vshufpd_avx(auVar138,auVar138,5);
          auVar138 = vminps_avx(auVar138,auVar191);
          auVar191 = vperm2f128_avx(auVar138,auVar138,1);
          auVar138 = vminps_avx(auVar138,auVar191);
          auVar138 = vcmpps_avx(auVar351,auVar138,0);
          auVar191 = auVar96 & auVar138;
          auVar351 = auVar96;
          if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar191 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar191 >> 0x7f,0) != '\0') ||
                (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar191 >> 0xbf,0) != '\0') ||
              (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar191[0x1f] < '\0') {
            auVar351 = vandps_avx(auVar138,auVar96);
          }
          uVar69 = vmovmskps_avx(auVar351);
          uVar72 = 0;
          if (uVar69 != 0) {
            for (; (uVar69 >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
            }
          }
          uVar71 = (ulong)uVar72;
          local_620 = auVar96;
          *(undefined4 *)(local_620 + uVar71 * 4) = 0;
          aVar7 = (ray->dir).field_0;
          _local_920 = (undefined1  [16])aVar7;
          auVar188 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
          fVar229 = local_1c0[uVar71];
          uVar72 = *(uint *)(local_460 + uVar71 * 4);
          if (auVar188._0_4_ < 0.0) {
            fVar174 = sqrtf(auVar188._0_4_);
          }
          else {
            auVar188 = vsqrtss_avx(auVar188,auVar188);
            fVar174 = auVar188._0_4_;
          }
          auVar13 = vminps_avx(_local_960,_local_980);
          auVar188 = vmaxps_avx(_local_960,_local_980);
          auVar14 = vminps_avx(_local_970,_local_990);
          auVar92 = vminps_avx(auVar13,auVar14);
          auVar13 = vmaxps_avx(_local_970,_local_990);
          auVar14 = vmaxps_avx(auVar188,auVar13);
          auVar183._8_4_ = 0x7fffffff;
          auVar183._0_8_ = 0x7fffffff7fffffff;
          auVar183._12_4_ = 0x7fffffff;
          auVar188 = vandps_avx(auVar92,auVar183);
          auVar13 = vandps_avx(auVar14,auVar183);
          auVar188 = vmaxps_avx(auVar188,auVar13);
          auVar13 = vmovshdup_avx(auVar188);
          auVar13 = vmaxss_avx(auVar13,auVar188);
          auVar188 = vshufpd_avx(auVar188,auVar188,1);
          auVar188 = vmaxss_avx(auVar188,auVar13);
          local_860._0_4_ = auVar188._0_4_ * 1.9073486e-06;
          local_800._0_4_ = fVar174 * 1.9073486e-06;
          local_6c0._0_16_ = vshufps_avx(auVar14,auVar14,0xff);
          auVar188 = vinsertps_avx(ZEXT416(uVar72),ZEXT416((uint)fVar229),0x10);
          bVar77 = true;
          uVar71 = 0;
          do {
            auVar13 = vmovshdup_avx(auVar188);
            fVar199 = auVar13._0_4_;
            local_a40._0_4_ = 1.0 - fVar199;
            auVar13 = vshufps_avx(auVar188,auVar188,0x55);
            fVar229 = auVar13._0_4_;
            fVar174 = auVar13._4_4_;
            fVar249 = auVar13._8_4_;
            fVar196 = auVar13._12_4_;
            auVar13 = vshufps_avx(ZEXT416((uint)local_a40._0_4_),ZEXT416((uint)local_a40._0_4_),0);
            fVar252 = auVar13._0_4_;
            fVar197 = auVar13._4_4_;
            fVar255 = auVar13._8_4_;
            fVar198 = auVar13._12_4_;
            fVar265 = (float)local_970._0_4_ * fVar229 + (float)local_980._0_4_ * fVar252;
            fVar275 = (float)local_970._4_4_ * fVar174 + (float)local_980._4_4_ * fVar197;
            fVar277 = fStack_968 * fVar249 + fStack_978 * fVar255;
            fVar280 = fStack_964 * fVar196 + fStack_974 * fVar198;
            auVar236._0_4_ =
                 fVar252 * ((float)local_980._0_4_ * fVar229 + fVar252 * (float)local_960._0_4_) +
                 fVar229 * fVar265;
            auVar236._4_4_ =
                 fVar197 * ((float)local_980._4_4_ * fVar174 + fVar197 * (float)local_960._4_4_) +
                 fVar174 * fVar275;
            auVar236._8_4_ =
                 fVar255 * (fStack_978 * fVar249 + fVar255 * fStack_958) + fVar249 * fVar277;
            auVar236._12_4_ =
                 fVar198 * (fStack_974 * fVar196 + fVar198 * fStack_954) + fVar196 * fVar280;
            auVar184._0_4_ =
                 fVar252 * fVar265 +
                 fVar229 * (fVar229 * (float)local_990._0_4_ + (float)local_970._0_4_ * fVar252);
            auVar184._4_4_ =
                 fVar197 * fVar275 +
                 fVar174 * (fVar174 * (float)local_990._4_4_ + (float)local_970._4_4_ * fVar197);
            auVar184._8_4_ =
                 fVar255 * fVar277 + fVar249 * (fVar249 * fStack_988 + fStack_968 * fVar255);
            auVar184._12_4_ =
                 fVar198 * fVar280 + fVar196 * (fVar196 * fStack_984 + fStack_964 * fVar198);
            auVar13 = vshufps_avx(auVar188,auVar188,0);
            auVar134._0_4_ = auVar13._0_4_ * (float)local_920._0_4_ + 0.0;
            auVar134._4_4_ = auVar13._4_4_ * (float)local_920._4_4_ + 0.0;
            auVar134._8_4_ = auVar13._8_4_ * fStack_918 + 0.0;
            auVar134._12_4_ = auVar13._12_4_ * fStack_914 + 0.0;
            auVar91._0_4_ = fVar252 * auVar236._0_4_ + fVar229 * auVar184._0_4_;
            auVar91._4_4_ = fVar197 * auVar236._4_4_ + fVar174 * auVar184._4_4_;
            auVar91._8_4_ = fVar255 * auVar236._8_4_ + fVar249 * auVar184._8_4_;
            auVar91._12_4_ = fVar198 * auVar236._12_4_ + fVar196 * auVar184._12_4_;
            local_7e0._0_16_ = auVar91;
            auVar13 = vsubps_avx(auVar134,auVar91);
            _local_880 = auVar13;
            auVar13 = vdpps_avx(auVar13,auVar13,0x7f);
            fVar229 = auVar13._0_4_;
            if (fVar229 < 0.0) {
              local_a40._0_16_ = ZEXT416((uint)local_a40._0_4_);
              local_a60._0_16_ = auVar236;
              local_a80._0_16_ = auVar184;
              fVar174 = sqrtf(fVar229);
              auVar184 = local_a80._0_16_;
              auVar236 = local_a60._0_16_;
            }
            else {
              auVar14 = vsqrtss_avx(auVar13,auVar13);
              fVar174 = auVar14._0_4_;
            }
            auVar14 = vsubps_avx(auVar184,auVar236);
            auVar294._0_4_ = auVar14._0_4_ * 3.0;
            auVar294._4_4_ = auVar14._4_4_ * 3.0;
            auVar294._8_4_ = auVar14._8_4_ * 3.0;
            auVar294._12_4_ = auVar14._12_4_ * 3.0;
            auVar14 = vshufps_avx(ZEXT416((uint)(fVar199 * 6.0)),ZEXT416((uint)(fVar199 * 6.0)),0);
            auVar92 = ZEXT416((uint)(((float)local_a40._0_4_ - (fVar199 + fVar199)) * 6.0));
            auVar162 = vshufps_avx(auVar92,auVar92,0);
            auVar92 = ZEXT416((uint)((fVar199 - ((float)local_a40._0_4_ + (float)local_a40._0_4_)) *
                                    6.0));
            auVar185 = vshufps_avx(auVar92,auVar92,0);
            auVar82 = vshufps_avx(ZEXT416((uint)((float)local_a40._0_4_ * 6.0)),
                                  ZEXT416((uint)((float)local_a40._0_4_ * 6.0)),0);
            auVar92 = vdpps_avx(auVar294,auVar294,0x7f);
            auVar135._0_4_ =
                 auVar82._0_4_ * (float)local_960._0_4_ +
                 auVar185._0_4_ * (float)local_980._0_4_ +
                 auVar14._0_4_ * (float)local_990._0_4_ + auVar162._0_4_ * (float)local_970._0_4_;
            auVar135._4_4_ =
                 auVar82._4_4_ * (float)local_960._4_4_ +
                 auVar185._4_4_ * (float)local_980._4_4_ +
                 auVar14._4_4_ * (float)local_990._4_4_ + auVar162._4_4_ * (float)local_970._4_4_;
            auVar135._8_4_ =
                 auVar82._8_4_ * fStack_958 +
                 auVar185._8_4_ * fStack_978 +
                 auVar14._8_4_ * fStack_988 + auVar162._8_4_ * fStack_968;
            auVar135._12_4_ =
                 auVar82._12_4_ * fStack_954 +
                 auVar185._12_4_ * fStack_974 +
                 auVar14._12_4_ * fStack_984 + auVar162._12_4_ * fStack_964;
            auVar14 = vblendps_avx(auVar92,_DAT_01f7aa10,0xe);
            auVar162 = vrsqrtss_avx(auVar14,auVar14);
            fVar196 = auVar162._0_4_;
            fVar249 = auVar92._0_4_;
            auVar162 = vdpps_avx(auVar294,auVar135,0x7f);
            auVar185 = vshufps_avx(auVar92,auVar92,0);
            auVar136._0_4_ = auVar135._0_4_ * auVar185._0_4_;
            auVar136._4_4_ = auVar135._4_4_ * auVar185._4_4_;
            auVar136._8_4_ = auVar135._8_4_ * auVar185._8_4_;
            auVar136._12_4_ = auVar135._12_4_ * auVar185._12_4_;
            auVar162 = vshufps_avx(auVar162,auVar162,0);
            auVar213._0_4_ = auVar294._0_4_ * auVar162._0_4_;
            auVar213._4_4_ = auVar294._4_4_ * auVar162._4_4_;
            auVar213._8_4_ = auVar294._8_4_ * auVar162._8_4_;
            auVar213._12_4_ = auVar294._12_4_ * auVar162._12_4_;
            auVar82 = vsubps_avx(auVar136,auVar213);
            auVar162 = vrcpss_avx(auVar14,auVar14);
            auVar14 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                 ZEXT416((uint)(auVar188._0_4_ * (float)local_800._0_4_)));
            auVar162 = ZEXT416((uint)(auVar162._0_4_ * (2.0 - fVar249 * auVar162._0_4_)));
            auVar162 = vshufps_avx(auVar162,auVar162,0);
            uVar61 = CONCAT44(auVar294._4_4_,auVar294._0_4_);
            auVar318._0_8_ = uVar61 ^ 0x8000000080000000;
            auVar318._8_4_ = -auVar294._8_4_;
            auVar318._12_4_ = -auVar294._12_4_;
            auVar185 = ZEXT416((uint)(fVar196 * 1.5 + fVar249 * -0.5 * fVar196 * fVar196 * fVar196))
            ;
            auVar185 = vshufps_avx(auVar185,auVar185,0);
            auVar186._0_4_ = auVar185._0_4_ * auVar82._0_4_ * auVar162._0_4_;
            auVar186._4_4_ = auVar185._4_4_ * auVar82._4_4_ * auVar162._4_4_;
            auVar186._8_4_ = auVar185._8_4_ * auVar82._8_4_ * auVar162._8_4_;
            auVar186._12_4_ = auVar185._12_4_ * auVar82._12_4_ * auVar162._12_4_;
            auVar269._0_4_ = auVar294._0_4_ * auVar185._0_4_;
            auVar269._4_4_ = auVar294._4_4_ * auVar185._4_4_;
            auVar269._8_4_ = auVar294._8_4_ * auVar185._8_4_;
            auVar269._12_4_ = auVar294._12_4_ * auVar185._12_4_;
            local_a40._0_16_ = auVar294;
            if (fVar249 < 0.0) {
              local_a60._0_4_ = fVar174;
              local_a80._0_16_ = auVar318;
              local_820._0_16_ = auVar269;
              local_840._0_16_ = auVar186;
              fVar249 = sqrtf(fVar249);
              auVar186 = local_840._0_16_;
              auVar269 = local_820._0_16_;
              auVar318 = local_a80._0_16_;
            }
            else {
              auVar92 = vsqrtss_avx(auVar92,auVar92);
              fVar249 = auVar92._0_4_;
              local_a60._0_4_ = fVar174;
            }
            auVar92 = vdpps_avx(_local_880,auVar269,0x7f);
            local_a80._0_4_ =
                 ((float)local_860._0_4_ / fVar249) * ((float)local_a60._0_4_ + 1.0) +
                 (float)local_a60._0_4_ * (float)local_860._0_4_ + auVar14._0_4_;
            auVar162 = vdpps_avx(auVar318,auVar269,0x7f);
            auVar185 = vdpps_avx(_local_880,auVar186,0x7f);
            auVar82 = vdpps_avx(_local_920,auVar269,0x7f);
            auVar83 = vdpps_avx(_local_880,auVar318,0x7f);
            fVar174 = auVar162._0_4_ + auVar185._0_4_;
            fVar249 = auVar92._0_4_;
            auVar93._0_4_ = fVar249 * fVar249;
            auVar93._4_4_ = auVar92._4_4_ * auVar92._4_4_;
            auVar93._8_4_ = auVar92._8_4_ * auVar92._8_4_;
            auVar93._12_4_ = auVar92._12_4_ * auVar92._12_4_;
            auVar185 = vsubps_avx(auVar13,auVar93);
            auVar162 = vdpps_avx(_local_880,_local_920,0x7f);
            fVar196 = auVar83._0_4_ - fVar174 * fVar249;
            local_a60._0_16_ = auVar92;
            fVar252 = auVar162._0_4_ - fVar249 * auVar82._0_4_;
            auVar92 = vrsqrtss_avx(auVar185,auVar185);
            fVar197 = auVar185._0_4_;
            fVar249 = auVar92._0_4_;
            fVar249 = fVar249 * 1.5 + fVar197 * -0.5 * fVar249 * fVar249 * fVar249;
            if (fVar197 < 0.0) {
              local_820._0_16_ = auVar82;
              local_840._0_16_ = ZEXT416((uint)fVar174);
              local_660._0_4_ = fVar196;
              local_680._0_4_ = fVar252;
              local_6a0._0_4_ = fVar249;
              fVar197 = sqrtf(fVar197);
              fVar249 = (float)local_6a0._0_4_;
              fVar196 = (float)local_660._0_4_;
              fVar252 = (float)local_680._0_4_;
              auVar82 = local_820._0_16_;
              auVar92 = local_840._0_16_;
            }
            else {
              auVar92 = vsqrtss_avx(auVar185,auVar185);
              fVar197 = auVar92._0_4_;
              auVar92 = ZEXT416((uint)fVar174);
            }
            auVar302 = ZEXT3264(local_9e0);
            auVar336 = ZEXT3264(local_a00);
            auVar340 = ZEXT3264(local_a20);
            auVar389 = ZEXT3264(local_8e0);
            auVar366 = ZEXT3264(local_9c0);
            auVar322 = ZEXT3264(local_900);
            auVar137 = vpermilps_avx(local_7e0._0_16_,0xff);
            auVar83 = vshufps_avx(local_a40._0_16_,local_a40._0_16_,0xff);
            fVar174 = fVar196 * fVar249 - auVar83._0_4_;
            auVar214._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
            auVar214._8_4_ = auVar82._8_4_ ^ 0x80000000;
            auVar214._12_4_ = auVar82._12_4_ ^ 0x80000000;
            auVar237._0_4_ = -fVar174;
            auVar237._4_4_ = 0x80000000;
            auVar237._8_4_ = 0x80000000;
            auVar237._12_4_ = 0x80000000;
            auVar162 = vinsertps_avx(auVar237,ZEXT416((uint)(fVar252 * fVar249)),0x1c);
            auVar185 = vmovsldup_avx(ZEXT416((uint)(auVar92._0_4_ * fVar252 * fVar249 -
                                                   auVar82._0_4_ * fVar174)));
            auVar162 = vdivps_avx(auVar162,auVar185);
            auVar92 = vinsertps_avx(auVar92,auVar214,0x10);
            auVar92 = vdivps_avx(auVar92,auVar185);
            auVar185 = vmovsldup_avx(local_a60._0_16_);
            auVar137 = ZEXT416((uint)(fVar197 - auVar137._0_4_));
            auVar82 = vmovsldup_avx(auVar137);
            auVar163._0_4_ = auVar185._0_4_ * auVar162._0_4_ + auVar82._0_4_ * auVar92._0_4_;
            auVar163._4_4_ = auVar185._4_4_ * auVar162._4_4_ + auVar82._4_4_ * auVar92._4_4_;
            auVar163._8_4_ = auVar185._8_4_ * auVar162._8_4_ + auVar82._8_4_ * auVar92._8_4_;
            auVar163._12_4_ = auVar185._12_4_ * auVar162._12_4_ + auVar82._12_4_ * auVar92._12_4_;
            auVar188 = vsubps_avx(auVar188,auVar163);
            auVar164._8_4_ = 0x7fffffff;
            auVar164._0_8_ = 0x7fffffff7fffffff;
            auVar164._12_4_ = 0x7fffffff;
            auVar92 = vandps_avx(local_a60._0_16_,auVar164);
            if (auVar92._0_4_ < (float)local_a80._0_4_) {
              auVar187._8_4_ = 0x7fffffff;
              auVar187._0_8_ = 0x7fffffff7fffffff;
              auVar187._12_4_ = 0x7fffffff;
              auVar92 = vandps_avx(auVar137,auVar187);
              if (auVar92._0_4_ <
                  (float)local_6c0._0_4_ * 1.9073486e-06 + (float)local_a80._0_4_ + auVar14._0_4_) {
                fVar174 = auVar188._0_4_ + (float)local_7c0._0_4_;
                bVar67 = 0;
                if (((ray->org).field_0.m128[3] <= fVar174) &&
                   (fVar249 = ray->tfar, bVar67 = 0, fVar174 <= fVar249)) {
                  auVar188 = vmovshdup_avx(auVar188);
                  bVar67 = 0;
                  fVar196 = auVar188._0_4_;
                  if ((0.0 <= fVar196) && (fVar196 <= 1.0)) {
                    auVar188 = vrsqrtss_avx(auVar13,auVar13);
                    fVar252 = auVar188._0_4_;
                    pGVar9 = (context->scene->geometries).items[uVar68].ptr;
                    if ((pGVar9->mask & ray->mask) == 0) {
                      bVar67 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar67 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar188 = ZEXT416((uint)(fVar252 * 1.5 +
                                               fVar229 * -0.5 * fVar252 * fVar252 * fVar252));
                      auVar188 = vshufps_avx(auVar188,auVar188,0);
                      auVar189._0_4_ = auVar188._0_4_ * (float)local_880._0_4_;
                      auVar189._4_4_ = auVar188._4_4_ * (float)local_880._4_4_;
                      auVar189._8_4_ = auVar188._8_4_ * fStack_878;
                      auVar189._12_4_ = auVar188._12_4_ * fStack_874;
                      auVar94._0_4_ = local_a40._0_4_ + auVar83._0_4_ * auVar189._0_4_;
                      auVar94._4_4_ = local_a40._4_4_ + auVar83._4_4_ * auVar189._4_4_;
                      auVar94._8_4_ = local_a40._8_4_ + auVar83._8_4_ * auVar189._8_4_;
                      auVar94._12_4_ = local_a40._12_4_ + auVar83._12_4_ * auVar189._12_4_;
                      auVar188 = vshufps_avx(auVar189,auVar189,0xc9);
                      auVar13 = vshufps_avx(local_a40._0_16_,local_a40._0_16_,0xc9);
                      auVar190._0_4_ = auVar13._0_4_ * auVar189._0_4_;
                      auVar190._4_4_ = auVar13._4_4_ * auVar189._4_4_;
                      auVar190._8_4_ = auVar13._8_4_ * auVar189._8_4_;
                      auVar190._12_4_ = auVar13._12_4_ * auVar189._12_4_;
                      auVar215._0_4_ = local_a40._0_4_ * auVar188._0_4_;
                      auVar215._4_4_ = local_a40._4_4_ * auVar188._4_4_;
                      auVar215._8_4_ = local_a40._8_4_ * auVar188._8_4_;
                      auVar215._12_4_ = local_a40._12_4_ * auVar188._12_4_;
                      auVar14 = vsubps_avx(auVar215,auVar190);
                      auVar188 = vshufps_avx(auVar14,auVar14,0xc9);
                      auVar13 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar216._0_4_ = auVar13._0_4_ * auVar188._0_4_;
                      auVar216._4_4_ = auVar13._4_4_ * auVar188._4_4_;
                      auVar216._8_4_ = auVar13._8_4_ * auVar188._8_4_;
                      auVar216._12_4_ = auVar13._12_4_ * auVar188._12_4_;
                      auVar188 = vshufps_avx(auVar14,auVar14,0xd2);
                      auVar95._0_4_ = auVar94._0_4_ * auVar188._0_4_;
                      auVar95._4_4_ = auVar94._4_4_ * auVar188._4_4_;
                      auVar95._8_4_ = auVar94._8_4_ * auVar188._8_4_;
                      auVar95._12_4_ = auVar94._12_4_ * auVar188._12_4_;
                      auVar13 = vsubps_avx(auVar216,auVar95);
                      auVar188 = vshufps_avx(auVar13,auVar13,0xe9);
                      local_8c0 = vmovlps_avx(auVar188);
                      local_8b8 = auVar13._0_4_;
                      local_8b0 = 0;
                      local_8ac = (undefined4)local_888;
                      local_8a4 = context->user->instID[0];
                      local_8a0 = context->user->instPrimID[0];
                      ray->tfar = fVar174;
                      local_a84 = -1;
                      local_950.valid = &local_a84;
                      local_950.geometryUserPtr = pGVar9->userPtr;
                      local_950.context = context->user;
                      local_950.hit = (RTCHitN *)&local_8c0;
                      local_950.N = 1;
                      local_950.ray = (RTCRayN *)ray;
                      local_8b4 = fVar196;
                      local_8a8 = uVar68;
                      if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar9->occlusionFilterN)(&local_950), *local_950.valid != 0)) {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                              RTC_RAY_QUERY_FLAG_INCOHERENT ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) &&
                            ((*p_Var10)(&local_950), *local_950.valid == 0)))) goto LAB_00e468ef;
                        bVar67 = 1;
                      }
                      else {
LAB_00e468ef:
                        ray->tfar = fVar249;
                        bVar67 = 0;
                      }
                      auVar302 = ZEXT3264(local_9e0);
                      auVar336 = ZEXT3264(local_a00);
                      auVar340 = ZEXT3264(local_a20);
                      auVar389 = ZEXT3264(local_8e0);
                      auVar366 = ZEXT3264(local_9c0);
                      auVar322 = ZEXT3264(local_900);
                    }
                  }
                }
                goto LAB_00e46686;
              }
            }
            bVar77 = uVar71 < 4;
            uVar71 = uVar71 + 1;
          } while (uVar71 != 5);
          bVar77 = false;
          bVar67 = 5;
LAB_00e46686:
          bVar74 = (bool)(bVar74 | bVar77 & bVar67);
          fVar229 = ray->tfar;
          auVar102._4_4_ = fVar229;
          auVar102._0_4_ = fVar229;
          auVar102._8_4_ = fVar229;
          auVar102._12_4_ = fVar229;
          auVar102._16_4_ = fVar229;
          auVar102._20_4_ = fVar229;
          auVar102._24_4_ = fVar229;
          auVar102._28_4_ = fVar229;
          auVar351 = vcmpps_avx(_local_740,auVar102,2);
          auVar96 = vandps_avx(auVar351,local_620);
          auVar351 = local_620 & auVar351;
          local_620 = auVar96;
        } while ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar351 >> 0x7f,0) != '\0') ||
                   (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar351 >> 0xbf,0) != '\0') ||
                 (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar351[0x1f] < '\0');
      }
      auVar274 = ZEXT3264(_local_480);
      auVar96 = vandps_avx(local_500,local_4e0);
      auVar351 = vandps_avx(_local_7a0,_local_780);
      auVar221._0_4_ = (float)local_640._0_4_ + local_440._0_4_;
      auVar221._4_4_ = (float)local_640._4_4_ + local_440._4_4_;
      auVar221._8_4_ = fStack_638 + local_440._8_4_;
      auVar221._12_4_ = fStack_634 + local_440._12_4_;
      auVar221._16_4_ = fStack_630 + local_440._16_4_;
      auVar221._20_4_ = fStack_62c + local_440._20_4_;
      auVar221._24_4_ = fStack_628 + local_440._24_4_;
      auVar221._28_4_ = fStack_624 + local_440._28_4_;
      auVar97 = vcmpps_avx(auVar221,auVar102,2);
      auVar96 = vandps_avx(auVar97,auVar96);
      auVar222._0_4_ = (float)local_640._0_4_ + local_480._0_4_;
      auVar222._4_4_ = (float)local_640._4_4_ + local_480._4_4_;
      auVar222._8_4_ = fStack_638 + local_480._8_4_;
      auVar222._12_4_ = fStack_634 + local_480._12_4_;
      auVar222._16_4_ = fStack_630 + local_480._16_4_;
      auVar222._20_4_ = fStack_62c + local_480._20_4_;
      auVar222._24_4_ = fStack_628 + local_480._24_4_;
      auVar222._28_4_ = fStack_624 + local_480._28_4_;
      auVar97 = vcmpps_avx(auVar222,auVar102,2);
      auVar351 = vandps_avx(auVar97,auVar351);
      auVar351 = vorps_avx(auVar96,auVar351);
      if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar351 >> 0x7f,0) != '\0') ||
            (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar351 >> 0xbf,0) != '\0') ||
          (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar351[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar76 * 0x60) = auVar351;
        auVar96 = vblendvps_avx(_local_480,local_440,auVar96);
        *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x60) = auVar96;
        uVar3 = vmovlps_avx(local_490);
        (&uStack_140)[uVar76 * 0xc] = uVar3;
        aiStack_138[uVar76 * 0x18] = local_b44 + 1;
        iVar75 = iVar75 + 1;
      }
    }
    auVar351 = local_3a0;
    auVar6._0_4_ = ray->tfar;
    auVar6._4_4_ = ray->mask;
    auVar6._8_4_ = ray->id;
    auVar6._12_4_ = ray->flags;
    if (iVar75 == 0) break;
    fVar229 = ray->tfar;
    auVar140._4_4_ = fVar229;
    auVar140._0_4_ = fVar229;
    auVar140._8_4_ = fVar229;
    auVar140._12_4_ = fVar229;
    auVar140._16_4_ = fVar229;
    auVar140._20_4_ = fVar229;
    auVar140._24_4_ = fVar229;
    auVar140._28_4_ = fVar229;
    uVar72 = -iVar75;
    pauVar70 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar75 - 1) * 0x60);
    while( true ) {
      auVar96 = pauVar70[1];
      auVar166._0_4_ = auVar96._0_4_ + (float)local_640._0_4_;
      auVar166._4_4_ = auVar96._4_4_ + (float)local_640._4_4_;
      auVar166._8_4_ = auVar96._8_4_ + fStack_638;
      auVar166._12_4_ = auVar96._12_4_ + fStack_634;
      auVar166._16_4_ = auVar96._16_4_ + fStack_630;
      auVar166._20_4_ = auVar96._20_4_ + fStack_62c;
      auVar166._24_4_ = auVar96._24_4_ + fStack_628;
      auVar166._28_4_ = auVar96._28_4_ + fStack_624;
      auVar138 = vcmpps_avx(auVar166,auVar140,2);
      auVar97 = vandps_avx(auVar138,*pauVar70);
      local_440 = auVar97;
      auVar138 = *pauVar70 & auVar138;
      if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar138 >> 0x7f,0) != '\0') ||
            (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar138 >> 0xbf,0) != '\0') ||
          (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar138[0x1f] < '\0') break;
      pauVar70 = pauVar70 + -3;
      uVar72 = uVar72 + 1;
      if (uVar72 == 0) goto LAB_00e46b1a;
    }
    auVar100._8_4_ = 0x7f800000;
    auVar100._0_8_ = 0x7f8000007f800000;
    auVar100._12_4_ = 0x7f800000;
    auVar100._16_4_ = 0x7f800000;
    auVar100._20_4_ = 0x7f800000;
    auVar100._24_4_ = 0x7f800000;
    auVar100._28_4_ = 0x7f800000;
    auVar96 = vblendvps_avx(auVar100,auVar96,auVar97);
    auVar138 = vshufps_avx(auVar96,auVar96,0xb1);
    auVar138 = vminps_avx(auVar96,auVar138);
    auVar191 = vshufpd_avx(auVar138,auVar138,5);
    auVar138 = vminps_avx(auVar138,auVar191);
    auVar191 = vperm2f128_avx(auVar138,auVar138,1);
    auVar138 = vminps_avx(auVar138,auVar191);
    auVar96 = vcmpps_avx(auVar96,auVar138,0);
    auVar138 = auVar97 & auVar96;
    if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar138 >> 0x7f,0) != '\0') ||
          (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar138 >> 0xbf,0) != '\0') ||
        (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar138[0x1f] < '\0') {
      auVar97 = vandps_avx(auVar96,auVar97);
    }
    auVar86._8_8_ = 0;
    auVar86._0_8_ = *(ulong *)pauVar70[2];
    local_b44 = *(uint *)(pauVar70[2] + 8);
    uVar73 = vmovmskps_avx(auVar97);
    uVar69 = 0;
    if (uVar73 != 0) {
      for (; (uVar73 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
      }
    }
    *(undefined4 *)(local_440 + (ulong)uVar69 * 4) = 0;
    *pauVar70 = local_440;
    uVar73 = ~uVar72;
    if ((((((((local_440 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_440 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_440 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_440 >> 0x7f,0) != '\0') ||
          (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_440 >> 0xbf,0) != '\0') ||
        (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_440[0x1f] < '\0') {
      uVar73 = -uVar72;
    }
    uVar76 = (ulong)uVar73;
    auVar188 = vshufps_avx(auVar86,auVar86,0);
    auVar13 = vshufps_avx(auVar86,auVar86,0x55);
    auVar13 = vsubps_avx(auVar13,auVar188);
    local_480._4_4_ = auVar188._4_4_ + auVar13._4_4_ * 0.14285715;
    local_480._0_4_ = auVar188._0_4_ + auVar13._0_4_ * 0.0;
    fStack_478 = auVar188._8_4_ + auVar13._8_4_ * 0.2857143;
    fStack_474 = auVar188._12_4_ + auVar13._12_4_ * 0.42857146;
    fStack_470 = auVar188._0_4_ + auVar13._0_4_ * 0.5714286;
    fStack_46c = auVar188._4_4_ + auVar13._4_4_ * 0.71428573;
    fStack_468 = auVar188._8_4_ + auVar13._8_4_ * 0.8571429;
    fStack_464 = auVar188._12_4_ + auVar13._12_4_;
    local_490._8_8_ = 0;
    local_490._0_8_ = *(ulong *)(local_480 + (ulong)uVar69 * 4);
  } while( true );
LAB_00e46b1a:
  if (bVar74 != false) {
    return bVar74;
  }
  auVar188 = vshufps_avx(auVar6,auVar6,0);
  auVar188 = vcmpps_avx(local_4a0,auVar188,2);
  uVar68 = vmovmskps_avx(auVar188);
  uVar68 = (uint)local_7a8 - 1 & (uint)local_7a8 & uVar68;
  if (uVar68 == 0) {
    return false;
  }
  goto LAB_00e4431e;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }